

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::sse2::CurveNiMBIntersector1<4>::
     intersect_t<embree::sse2::RibbonCurve1Intersector1<embree::BezierCurveT,4>,embree::sse2::Intersect1EpilogMU<4,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined1 (*pauVar7) [16];
  Primitive *pPVar8;
  undefined1 *puVar9;
  undefined1 (*pauVar10) [12];
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  Primitive PVar19;
  int iVar20;
  Geometry *pGVar21;
  __int_type_conflict _Var22;
  long lVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  undefined1 auVar27 [16];
  undefined8 uVar28;
  undefined8 uVar29;
  undefined6 uVar30;
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  undefined1 auVar51 [12];
  bool bVar52;
  int iVar53;
  undefined4 uVar54;
  undefined4 uVar55;
  ulong uVar56;
  RayHit *pRVar57;
  int iVar59;
  RTCIntersectArguments *pRVar60;
  ulong uVar61;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  undefined8 uVar62;
  ulong uVar63;
  long lVar64;
  long lVar65;
  uint uVar66;
  uint uVar67;
  uint uVar68;
  uint uVar69;
  uint uVar70;
  uint uVar71;
  short sVar72;
  float fVar73;
  float fVar109;
  float fVar110;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar79 [16];
  undefined1 auVar82 [16];
  undefined1 auVar85 [16];
  undefined1 auVar88 [16];
  undefined1 auVar91 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar141;
  float fVar144;
  undefined1 auVar114 [16];
  undefined1 auVar117 [16];
  undefined1 auVar120 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar142;
  float fVar143;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar149;
  float fVar159;
  float fVar160;
  vfloat4 v;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar161;
  float fVar177;
  float fVar178;
  vfloat4 v_1;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  float fVar179;
  float fVar185;
  float fVar186;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  float fVar187;
  float fVar208;
  float fVar209;
  undefined1 auVar188 [16];
  undefined1 auVar191 [16];
  undefined1 auVar194 [16];
  undefined1 auVar197 [16];
  undefined1 auVar200 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar210;
  float fVar214;
  float fVar215;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  float fVar216;
  float fVar222;
  float fVar223;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar221 [16];
  float fVar224;
  float fVar226;
  float fVar227;
  undefined1 auVar225 [16];
  float fVar228;
  float fVar233;
  float fVar234;
  undefined1 auVar229 [16];
  undefined1 auVar232 [16];
  float fVar235;
  float fVar240;
  float fVar241;
  undefined1 auVar236 [16];
  undefined1 auVar239 [16];
  float fVar242;
  float fVar243;
  float fVar250;
  float fVar252;
  float fVar254;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar248 [16];
  float fVar251;
  float fVar253;
  float fVar255;
  undefined1 auVar249 [16];
  float fVar256;
  float fVar257;
  float fVar268;
  float fVar270;
  float fVar272;
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  float fVar269;
  float fVar271;
  float fVar273;
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  float fVar274;
  float fVar275;
  float fVar276;
  float fVar282;
  float fVar284;
  float fVar286;
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  float fVar283;
  float fVar285;
  float fVar287;
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  float fVar288;
  float fVar292;
  float fVar293;
  float fVar294;
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  float fVar295;
  float fVar296;
  float fVar297;
  float fVar298;
  float fVar299;
  float fVar300;
  float fVar301;
  float fVar302;
  float fVar303;
  float fVar304;
  float fVar305;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_4> bhit;
  undefined1 local_498 [8];
  float fStack_490;
  float fStack_48c;
  undefined1 local_47c [8];
  float fStack_474;
  undefined4 uStack_470;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aStack_46c;
  float fStack_45c;
  float local_458;
  float fStack_454;
  float fStack_450;
  anon_union_12_2_4062524c_for_Vec3<float>_1 aStack_44c;
  float fStack_440;
  float fStack_43c;
  float local_438;
  float fStack_434;
  uint auStack_430 [1];
  uint auStack_42c [1];
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  RTCIntersectArguments *local_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  ulong local_3c0;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  undefined1 local_368 [16];
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [16];
  Precalculations *local_320;
  RTCFilterFunctionNArguments local_318;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  undefined8 local_248;
  float local_240;
  float local_23c;
  undefined4 local_238;
  undefined4 local_234;
  undefined4 local_230;
  uint local_22c;
  uint local_228;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [8];
  float fStack_1c0;
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  Primitive *local_170;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  uint local_138;
  int local_134;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined1 local_e8 [16];
  float local_d8 [4];
  undefined8 local_c8;
  undefined8 uStack_c0;
  float local_b8 [4];
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  ulong uVar58;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 uVar107;
  undefined2 uVar108;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  
  PVar19 = prim[1];
  uVar56 = (ulong)(byte)PVar19;
  lVar23 = uVar56 * 0x25;
  pPVar8 = prim + lVar23 + 6;
  fVar160 = *(float *)(pPVar8 + 0xc);
  fVar161 = ((ray->super_RayK<1>).org.field_0.m128[0] - *(float *)pPVar8) * fVar160;
  fVar177 = ((ray->super_RayK<1>).org.field_0.m128[1] - *(float *)(pPVar8 + 4)) * fVar160;
  fVar178 = ((ray->super_RayK<1>).org.field_0.m128[2] - *(float *)(pPVar8 + 8)) * fVar160;
  fVar149 = fVar160 * (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar159 = fVar160 * (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar160 = fVar160 * (ray->super_RayK<1>).dir.field_0.m128[2];
  uVar54 = *(undefined4 *)(prim + uVar56 * 4 + 6);
  uVar107 = (undefined1)((uint)uVar54 >> 0x18);
  uVar108 = CONCAT11(uVar107,uVar107);
  uVar107 = (undefined1)((uint)uVar54 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar108,uVar107),CONCAT14(uVar107,uVar54));
  uVar107 = (undefined1)((uint)uVar54 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar107),uVar107);
  sVar72 = CONCAT11((char)uVar54,(char)uVar54);
  uVar58 = CONCAT62(uVar30,sVar72);
  auVar74._8_4_ = 0;
  auVar74._0_8_ = uVar58;
  auVar74._12_2_ = uVar108;
  auVar74._14_2_ = uVar108;
  uVar108 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar151._12_4_ = auVar74._12_4_;
  auVar151._8_2_ = 0;
  auVar151._0_8_ = uVar58;
  auVar151._10_2_ = uVar108;
  auVar75._10_6_ = auVar151._10_6_;
  auVar75._8_2_ = uVar108;
  auVar75._0_8_ = uVar58;
  uVar108 = (undefined2)uVar30;
  auVar31._4_8_ = auVar75._8_8_;
  auVar31._2_2_ = uVar108;
  auVar31._0_2_ = uVar108;
  fVar274 = (float)((int)sVar72 >> 8);
  fVar282 = (float)(auVar31._0_4_ >> 0x18);
  fVar284 = (float)(auVar75._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + uVar56 * 5 + 6);
  uVar107 = (undefined1)((uint)uVar54 >> 0x18);
  uVar108 = CONCAT11(uVar107,uVar107);
  uVar107 = (undefined1)((uint)uVar54 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar108,uVar107),CONCAT14(uVar107,uVar54));
  uVar107 = (undefined1)((uint)uVar54 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar107),uVar107);
  sVar72 = CONCAT11((char)uVar54,(char)uVar54);
  uVar58 = CONCAT62(uVar30,sVar72);
  auVar116._8_4_ = 0;
  auVar116._0_8_ = uVar58;
  auVar116._12_2_ = uVar108;
  auVar116._14_2_ = uVar108;
  uVar108 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar115._12_4_ = auVar116._12_4_;
  auVar115._8_2_ = 0;
  auVar115._0_8_ = uVar58;
  auVar115._10_2_ = uVar108;
  auVar114._10_6_ = auVar115._10_6_;
  auVar114._8_2_ = uVar108;
  auVar114._0_8_ = uVar58;
  uVar108 = (undefined2)uVar30;
  auVar32._4_8_ = auVar114._8_8_;
  auVar32._2_2_ = uVar108;
  auVar32._0_2_ = uVar108;
  fVar179 = (float)((int)sVar72 >> 8);
  fVar185 = (float)(auVar32._0_4_ >> 0x18);
  fVar186 = (float)(auVar114._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + uVar56 * 6 + 6);
  uVar107 = (undefined1)((uint)uVar54 >> 0x18);
  uVar108 = CONCAT11(uVar107,uVar107);
  uVar107 = (undefined1)((uint)uVar54 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar108,uVar107),CONCAT14(uVar107,uVar54));
  uVar107 = (undefined1)((uint)uVar54 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar107),uVar107);
  sVar72 = CONCAT11((char)uVar54,(char)uVar54);
  uVar58 = CONCAT62(uVar30,sVar72);
  auVar119._8_4_ = 0;
  auVar119._0_8_ = uVar58;
  auVar119._12_2_ = uVar108;
  auVar119._14_2_ = uVar108;
  uVar108 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar118._12_4_ = auVar119._12_4_;
  auVar118._8_2_ = 0;
  auVar118._0_8_ = uVar58;
  auVar118._10_2_ = uVar108;
  auVar117._10_6_ = auVar118._10_6_;
  auVar117._8_2_ = uVar108;
  auVar117._0_8_ = uVar58;
  uVar108 = (undefined2)uVar30;
  auVar33._4_8_ = auVar117._8_8_;
  auVar33._2_2_ = uVar108;
  auVar33._0_2_ = uVar108;
  fVar210 = (float)((int)sVar72 >> 8);
  fVar214 = (float)(auVar33._0_4_ >> 0x18);
  fVar215 = (float)(auVar117._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + uVar56 * 0xf + 6);
  uVar107 = (undefined1)((uint)uVar54 >> 0x18);
  uVar108 = CONCAT11(uVar107,uVar107);
  uVar107 = (undefined1)((uint)uVar54 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar108,uVar107),CONCAT14(uVar107,uVar54));
  uVar107 = (undefined1)((uint)uVar54 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar107),uVar107);
  sVar72 = CONCAT11((char)uVar54,(char)uVar54);
  uVar58 = CONCAT62(uVar30,sVar72);
  auVar122._8_4_ = 0;
  auVar122._0_8_ = uVar58;
  auVar122._12_2_ = uVar108;
  auVar122._14_2_ = uVar108;
  uVar108 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar121._12_4_ = auVar122._12_4_;
  auVar121._8_2_ = 0;
  auVar121._0_8_ = uVar58;
  auVar121._10_2_ = uVar108;
  auVar120._10_6_ = auVar121._10_6_;
  auVar120._8_2_ = uVar108;
  auVar120._0_8_ = uVar58;
  uVar108 = (undefined2)uVar30;
  auVar34._4_8_ = auVar120._8_8_;
  auVar34._2_2_ = uVar108;
  auVar34._0_2_ = uVar108;
  fVar73 = (float)((int)sVar72 >> 8);
  fVar109 = (float)(auVar34._0_4_ >> 0x18);
  fVar110 = (float)(auVar120._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + (ulong)(byte)PVar19 * 0x10 + 6);
  uVar107 = (undefined1)((uint)uVar54 >> 0x18);
  uVar108 = CONCAT11(uVar107,uVar107);
  uVar107 = (undefined1)((uint)uVar54 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar108,uVar107),CONCAT14(uVar107,uVar54));
  uVar107 = (undefined1)((uint)uVar54 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar107),uVar107);
  sVar72 = CONCAT11((char)uVar54,(char)uVar54);
  uVar58 = CONCAT62(uVar30,sVar72);
  auVar190._8_4_ = 0;
  auVar190._0_8_ = uVar58;
  auVar190._12_2_ = uVar108;
  auVar190._14_2_ = uVar108;
  uVar108 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar189._12_4_ = auVar190._12_4_;
  auVar189._8_2_ = 0;
  auVar189._0_8_ = uVar58;
  auVar189._10_2_ = uVar108;
  auVar188._10_6_ = auVar189._10_6_;
  auVar188._8_2_ = uVar108;
  auVar188._0_8_ = uVar58;
  uVar108 = (undefined2)uVar30;
  auVar35._4_8_ = auVar188._8_8_;
  auVar35._2_2_ = uVar108;
  auVar35._0_2_ = uVar108;
  fVar216 = (float)((int)sVar72 >> 8);
  fVar222 = (float)(auVar35._0_4_ >> 0x18);
  fVar223 = (float)(auVar188._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + (ulong)(byte)PVar19 * 0x10 + uVar56 + 6);
  uVar107 = (undefined1)((uint)uVar54 >> 0x18);
  uVar108 = CONCAT11(uVar107,uVar107);
  uVar107 = (undefined1)((uint)uVar54 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar108,uVar107),CONCAT14(uVar107,uVar54));
  uVar107 = (undefined1)((uint)uVar54 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar107),uVar107);
  sVar72 = CONCAT11((char)uVar54,(char)uVar54);
  uVar58 = CONCAT62(uVar30,sVar72);
  auVar193._8_4_ = 0;
  auVar193._0_8_ = uVar58;
  auVar193._12_2_ = uVar108;
  auVar193._14_2_ = uVar108;
  uVar108 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar192._12_4_ = auVar193._12_4_;
  auVar192._8_2_ = 0;
  auVar192._0_8_ = uVar58;
  auVar192._10_2_ = uVar108;
  auVar191._10_6_ = auVar192._10_6_;
  auVar191._8_2_ = uVar108;
  auVar191._0_8_ = uVar58;
  uVar108 = (undefined2)uVar30;
  auVar36._4_8_ = auVar191._8_8_;
  auVar36._2_2_ = uVar108;
  auVar36._0_2_ = uVar108;
  fVar228 = (float)((int)sVar72 >> 8);
  fVar233 = (float)(auVar36._0_4_ >> 0x18);
  fVar234 = (float)(auVar191._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + uVar56 * 0x1a + 6);
  uVar107 = (undefined1)((uint)uVar54 >> 0x18);
  uVar108 = CONCAT11(uVar107,uVar107);
  uVar107 = (undefined1)((uint)uVar54 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar108,uVar107),CONCAT14(uVar107,uVar54));
  uVar107 = (undefined1)((uint)uVar54 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar107),uVar107);
  sVar72 = CONCAT11((char)uVar54,(char)uVar54);
  uVar58 = CONCAT62(uVar30,sVar72);
  auVar196._8_4_ = 0;
  auVar196._0_8_ = uVar58;
  auVar196._12_2_ = uVar108;
  auVar196._14_2_ = uVar108;
  uVar108 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar195._12_4_ = auVar196._12_4_;
  auVar195._8_2_ = 0;
  auVar195._0_8_ = uVar58;
  auVar195._10_2_ = uVar108;
  auVar194._10_6_ = auVar195._10_6_;
  auVar194._8_2_ = uVar108;
  auVar194._0_8_ = uVar58;
  uVar108 = (undefined2)uVar30;
  auVar37._4_8_ = auVar194._8_8_;
  auVar37._2_2_ = uVar108;
  auVar37._0_2_ = uVar108;
  fVar224 = (float)((int)sVar72 >> 8);
  fVar226 = (float)(auVar37._0_4_ >> 0x18);
  fVar227 = (float)(auVar194._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + uVar56 * 0x1b + 6);
  uVar107 = (undefined1)((uint)uVar54 >> 0x18);
  uVar108 = CONCAT11(uVar107,uVar107);
  uVar107 = (undefined1)((uint)uVar54 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar108,uVar107),CONCAT14(uVar107,uVar54));
  uVar107 = (undefined1)((uint)uVar54 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar107),uVar107);
  sVar72 = CONCAT11((char)uVar54,(char)uVar54);
  uVar58 = CONCAT62(uVar30,sVar72);
  auVar199._8_4_ = 0;
  auVar199._0_8_ = uVar58;
  auVar199._12_2_ = uVar108;
  auVar199._14_2_ = uVar108;
  uVar108 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar198._12_4_ = auVar199._12_4_;
  auVar198._8_2_ = 0;
  auVar198._0_8_ = uVar58;
  auVar198._10_2_ = uVar108;
  auVar197._10_6_ = auVar198._10_6_;
  auVar197._8_2_ = uVar108;
  auVar197._0_8_ = uVar58;
  uVar108 = (undefined2)uVar30;
  auVar38._4_8_ = auVar197._8_8_;
  auVar38._2_2_ = uVar108;
  auVar38._0_2_ = uVar108;
  fVar235 = (float)((int)sVar72 >> 8);
  fVar240 = (float)(auVar38._0_4_ >> 0x18);
  fVar241 = (float)(auVar197._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + uVar56 * 0x1c + 6);
  uVar107 = (undefined1)((uint)uVar54 >> 0x18);
  uVar108 = CONCAT11(uVar107,uVar107);
  uVar107 = (undefined1)((uint)uVar54 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar108,uVar107),CONCAT14(uVar107,uVar54));
  uVar107 = (undefined1)((uint)uVar54 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar107),uVar107);
  sVar72 = CONCAT11((char)uVar54,(char)uVar54);
  uVar58 = CONCAT62(uVar30,sVar72);
  auVar202._8_4_ = 0;
  auVar202._0_8_ = uVar58;
  auVar202._12_2_ = uVar108;
  auVar202._14_2_ = uVar108;
  uVar108 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar201._12_4_ = auVar202._12_4_;
  auVar201._8_2_ = 0;
  auVar201._0_8_ = uVar58;
  auVar201._10_2_ = uVar108;
  auVar200._10_6_ = auVar201._10_6_;
  auVar200._8_2_ = uVar108;
  auVar200._0_8_ = uVar58;
  uVar108 = (undefined2)uVar30;
  auVar39._4_8_ = auVar200._8_8_;
  auVar39._2_2_ = uVar108;
  auVar39._0_2_ = uVar108;
  fVar111 = (float)((int)sVar72 >> 8);
  fVar141 = (float)(auVar39._0_4_ >> 0x18);
  fVar144 = (float)(auVar200._8_4_ >> 0x18);
  fVar256 = fVar149 * fVar274 + fVar159 * fVar179 + fVar160 * fVar210;
  fVar268 = fVar149 * fVar282 + fVar159 * fVar185 + fVar160 * fVar214;
  fVar270 = fVar149 * fVar284 + fVar159 * fVar186 + fVar160 * fVar215;
  fVar272 = fVar149 * (float)(auVar151._12_4_ >> 0x18) +
            fVar159 * (float)(auVar115._12_4_ >> 0x18) + fVar160 * (float)(auVar118._12_4_ >> 0x18);
  fVar242 = fVar149 * fVar73 + fVar159 * fVar216 + fVar160 * fVar228;
  fVar250 = fVar149 * fVar109 + fVar159 * fVar222 + fVar160 * fVar233;
  fVar252 = fVar149 * fVar110 + fVar159 * fVar223 + fVar160 * fVar234;
  fVar254 = fVar149 * (float)(auVar121._12_4_ >> 0x18) +
            fVar159 * (float)(auVar189._12_4_ >> 0x18) + fVar160 * (float)(auVar192._12_4_ >> 0x18);
  fVar187 = fVar149 * fVar224 + fVar159 * fVar235 + fVar160 * fVar111;
  fVar208 = fVar149 * fVar226 + fVar159 * fVar240 + fVar160 * fVar141;
  fVar209 = fVar149 * fVar227 + fVar159 * fVar241 + fVar160 * fVar144;
  fVar149 = fVar149 * (float)(auVar195._12_4_ >> 0x18) +
            fVar159 * (float)(auVar198._12_4_ >> 0x18) + fVar160 * (float)(auVar201._12_4_ >> 0x18);
  fVar275 = fVar274 * fVar161 + fVar179 * fVar177 + fVar210 * fVar178;
  fVar282 = fVar282 * fVar161 + fVar185 * fVar177 + fVar214 * fVar178;
  fVar284 = fVar284 * fVar161 + fVar186 * fVar177 + fVar215 * fVar178;
  fVar286 = (float)(auVar151._12_4_ >> 0x18) * fVar161 +
            (float)(auVar115._12_4_ >> 0x18) * fVar177 + (float)(auVar118._12_4_ >> 0x18) * fVar178;
  fVar228 = fVar73 * fVar161 + fVar216 * fVar177 + fVar228 * fVar178;
  fVar233 = fVar109 * fVar161 + fVar222 * fVar177 + fVar233 * fVar178;
  fVar234 = fVar110 * fVar161 + fVar223 * fVar177 + fVar234 * fVar178;
  fVar274 = (float)(auVar121._12_4_ >> 0x18) * fVar161 +
            (float)(auVar189._12_4_ >> 0x18) * fVar177 + (float)(auVar192._12_4_ >> 0x18) * fVar178;
  fVar224 = fVar161 * fVar224 + fVar177 * fVar235 + fVar178 * fVar111;
  fVar226 = fVar161 * fVar226 + fVar177 * fVar240 + fVar178 * fVar141;
  fVar227 = fVar161 * fVar227 + fVar177 * fVar241 + fVar178 * fVar144;
  fVar235 = fVar161 * (float)(auVar195._12_4_ >> 0x18) +
            fVar177 * (float)(auVar198._12_4_ >> 0x18) + fVar178 * (float)(auVar201._12_4_ >> 0x18);
  fVar160 = (float)DAT_01f80d30;
  fVar73 = DAT_01f80d30._4_4_;
  fVar109 = DAT_01f80d30._8_4_;
  fVar110 = DAT_01f80d30._12_4_;
  uVar66 = -(uint)(fVar160 <= ABS(fVar256));
  uVar67 = -(uint)(fVar73 <= ABS(fVar268));
  uVar68 = -(uint)(fVar109 <= ABS(fVar270));
  uVar69 = -(uint)(fVar110 <= ABS(fVar272));
  auVar258._0_4_ = (uint)fVar256 & uVar66;
  auVar258._4_4_ = (uint)fVar268 & uVar67;
  auVar258._8_4_ = (uint)fVar270 & uVar68;
  auVar258._12_4_ = (uint)fVar272 & uVar69;
  auVar162._0_4_ = ~uVar66 & (uint)fVar160;
  auVar162._4_4_ = ~uVar67 & (uint)fVar73;
  auVar162._8_4_ = ~uVar68 & (uint)fVar109;
  auVar162._12_4_ = ~uVar69 & (uint)fVar110;
  auVar162 = auVar162 | auVar258;
  uVar66 = -(uint)(fVar160 <= ABS(fVar242));
  uVar67 = -(uint)(fVar73 <= ABS(fVar250));
  uVar68 = -(uint)(fVar109 <= ABS(fVar252));
  uVar69 = -(uint)(fVar110 <= ABS(fVar254));
  auVar244._0_4_ = (uint)fVar242 & uVar66;
  auVar244._4_4_ = (uint)fVar250 & uVar67;
  auVar244._8_4_ = (uint)fVar252 & uVar68;
  auVar244._12_4_ = (uint)fVar254 & uVar69;
  auVar211._0_4_ = ~uVar66 & (uint)fVar160;
  auVar211._4_4_ = ~uVar67 & (uint)fVar73;
  auVar211._8_4_ = ~uVar68 & (uint)fVar109;
  auVar211._12_4_ = ~uVar69 & (uint)fVar110;
  auVar211 = auVar211 | auVar244;
  uVar66 = -(uint)(fVar160 <= ABS(fVar187));
  uVar67 = -(uint)(fVar73 <= ABS(fVar208));
  uVar68 = -(uint)(fVar109 <= ABS(fVar209));
  uVar69 = -(uint)(fVar110 <= ABS(fVar149));
  auVar203._0_4_ = (uint)fVar187 & uVar66;
  auVar203._4_4_ = (uint)fVar208 & uVar67;
  auVar203._8_4_ = (uint)fVar209 & uVar68;
  auVar203._12_4_ = (uint)fVar149 & uVar69;
  auVar217._0_4_ = ~uVar66 & (uint)fVar160;
  auVar217._4_4_ = ~uVar67 & (uint)fVar73;
  auVar217._8_4_ = ~uVar68 & (uint)fVar109;
  auVar217._12_4_ = ~uVar69 & (uint)fVar110;
  auVar217 = auVar217 | auVar203;
  auVar75 = rcpps(_DAT_01f80d30,auVar162);
  fVar160 = auVar75._0_4_;
  fVar110 = auVar75._4_4_;
  fVar179 = auVar75._8_4_;
  fVar216 = auVar75._12_4_;
  fVar160 = (1.0 - auVar162._0_4_ * fVar160) * fVar160 + fVar160;
  fVar110 = (1.0 - auVar162._4_4_ * fVar110) * fVar110 + fVar110;
  fVar179 = (1.0 - auVar162._8_4_ * fVar179) * fVar179 + fVar179;
  fVar216 = (1.0 - auVar162._12_4_ * fVar216) * fVar216 + fVar216;
  auVar75 = rcpps(auVar75,auVar211);
  fVar73 = auVar75._0_4_;
  fVar111 = auVar75._4_4_;
  fVar185 = auVar75._8_4_;
  fVar222 = auVar75._12_4_;
  fVar73 = (1.0 - auVar211._0_4_ * fVar73) * fVar73 + fVar73;
  fVar111 = (1.0 - auVar211._4_4_ * fVar111) * fVar111 + fVar111;
  fVar185 = (1.0 - auVar211._8_4_ * fVar185) * fVar185 + fVar185;
  fVar222 = (1.0 - auVar211._12_4_ * fVar222) * fVar222 + fVar222;
  auVar75 = rcpps(auVar75,auVar217);
  fVar109 = auVar75._0_4_;
  fVar141 = auVar75._4_4_;
  fVar186 = auVar75._8_4_;
  fVar223 = auVar75._12_4_;
  fVar109 = (1.0 - auVar217._0_4_ * fVar109) * fVar109 + fVar109;
  fVar141 = (1.0 - auVar217._4_4_ * fVar141) * fVar141 + fVar141;
  fVar186 = (1.0 - auVar217._8_4_ * fVar186) * fVar186 + fVar186;
  fVar223 = (1.0 - auVar217._12_4_ * fVar223) * fVar223 + fVar223;
  fVar240 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar23 + 0x16)) *
            *(float *)(prim + lVar23 + 0x1a);
  uVar58 = *(ulong *)(prim + uVar56 * 7 + 6);
  uVar108 = (undefined2)(uVar58 >> 0x30);
  auVar78._8_4_ = 0;
  auVar78._0_8_ = uVar58;
  auVar78._12_2_ = uVar108;
  auVar78._14_2_ = uVar108;
  uVar108 = (undefined2)(uVar58 >> 0x20);
  auVar77._12_4_ = auVar78._12_4_;
  auVar77._8_2_ = 0;
  auVar77._0_8_ = uVar58;
  auVar77._10_2_ = uVar108;
  auVar76._10_6_ = auVar77._10_6_;
  auVar76._8_2_ = uVar108;
  auVar76._0_8_ = uVar58;
  uVar108 = (undefined2)(uVar58 >> 0x10);
  auVar40._4_8_ = auVar76._8_8_;
  auVar40._2_2_ = uVar108;
  auVar40._0_2_ = uVar108;
  fVar144 = (float)(auVar40._0_4_ >> 0x10);
  fVar187 = (float)(auVar76._8_4_ >> 0x10);
  uVar61 = *(ulong *)(prim + uVar56 * 0xb + 6);
  uVar108 = (undefined2)(uVar61 >> 0x30);
  auVar165._8_4_ = 0;
  auVar165._0_8_ = uVar61;
  auVar165._12_2_ = uVar108;
  auVar165._14_2_ = uVar108;
  uVar108 = (undefined2)(uVar61 >> 0x20);
  auVar164._12_4_ = auVar165._12_4_;
  auVar164._8_2_ = 0;
  auVar164._0_8_ = uVar61;
  auVar164._10_2_ = uVar108;
  auVar163._10_6_ = auVar164._10_6_;
  auVar163._8_2_ = uVar108;
  auVar163._0_8_ = uVar61;
  uVar108 = (undefined2)(uVar61 >> 0x10);
  auVar41._4_8_ = auVar163._8_8_;
  auVar41._2_2_ = uVar108;
  auVar41._0_2_ = uVar108;
  uVar11 = *(ulong *)(prim + uVar56 * 9 + 6);
  uVar108 = (undefined2)(uVar11 >> 0x30);
  auVar81._8_4_ = 0;
  auVar81._0_8_ = uVar11;
  auVar81._12_2_ = uVar108;
  auVar81._14_2_ = uVar108;
  uVar108 = (undefined2)(uVar11 >> 0x20);
  auVar80._12_4_ = auVar81._12_4_;
  auVar80._8_2_ = 0;
  auVar80._0_8_ = uVar11;
  auVar80._10_2_ = uVar108;
  auVar79._10_6_ = auVar80._10_6_;
  auVar79._8_2_ = uVar108;
  auVar79._0_8_ = uVar11;
  uVar108 = (undefined2)(uVar11 >> 0x10);
  auVar42._4_8_ = auVar79._8_8_;
  auVar42._2_2_ = uVar108;
  auVar42._0_2_ = uVar108;
  fVar149 = (float)(auVar42._0_4_ >> 0x10);
  fVar208 = (float)(auVar79._8_4_ >> 0x10);
  uVar12 = *(ulong *)(prim + uVar56 * 0xd + 6);
  uVar108 = (undefined2)(uVar12 >> 0x30);
  auVar220._8_4_ = 0;
  auVar220._0_8_ = uVar12;
  auVar220._12_2_ = uVar108;
  auVar220._14_2_ = uVar108;
  uVar108 = (undefined2)(uVar12 >> 0x20);
  auVar219._12_4_ = auVar220._12_4_;
  auVar219._8_2_ = 0;
  auVar219._0_8_ = uVar12;
  auVar219._10_2_ = uVar108;
  auVar218._10_6_ = auVar219._10_6_;
  auVar218._8_2_ = uVar108;
  auVar218._0_8_ = uVar12;
  uVar108 = (undefined2)(uVar12 >> 0x10);
  auVar43._4_8_ = auVar218._8_8_;
  auVar43._2_2_ = uVar108;
  auVar43._0_2_ = uVar108;
  uVar13 = *(ulong *)(prim + uVar56 * 0x12 + 6);
  uVar108 = (undefined2)(uVar13 >> 0x30);
  auVar84._8_4_ = 0;
  auVar84._0_8_ = uVar13;
  auVar84._12_2_ = uVar108;
  auVar84._14_2_ = uVar108;
  uVar108 = (undefined2)(uVar13 >> 0x20);
  auVar83._12_4_ = auVar84._12_4_;
  auVar83._8_2_ = 0;
  auVar83._0_8_ = uVar13;
  auVar83._10_2_ = uVar108;
  auVar82._10_6_ = auVar83._10_6_;
  auVar82._8_2_ = uVar108;
  auVar82._0_8_ = uVar13;
  uVar108 = (undefined2)(uVar13 >> 0x10);
  auVar44._4_8_ = auVar82._8_8_;
  auVar44._2_2_ = uVar108;
  auVar44._0_2_ = uVar108;
  fVar159 = (float)(auVar44._0_4_ >> 0x10);
  fVar209 = (float)(auVar82._8_4_ >> 0x10);
  uVar63 = (ulong)(uint)((int)(uVar56 * 5) << 2);
  uVar14 = *(ulong *)(prim + uVar56 * 2 + uVar63 + 6);
  uVar108 = (undefined2)(uVar14 >> 0x30);
  auVar231._8_4_ = 0;
  auVar231._0_8_ = uVar14;
  auVar231._12_2_ = uVar108;
  auVar231._14_2_ = uVar108;
  uVar108 = (undefined2)(uVar14 >> 0x20);
  auVar230._12_4_ = auVar231._12_4_;
  auVar230._8_2_ = 0;
  auVar230._0_8_ = uVar14;
  auVar230._10_2_ = uVar108;
  auVar229._10_6_ = auVar230._10_6_;
  auVar229._8_2_ = uVar108;
  auVar229._0_8_ = uVar14;
  uVar108 = (undefined2)(uVar14 >> 0x10);
  auVar45._4_8_ = auVar229._8_8_;
  auVar45._2_2_ = uVar108;
  auVar45._0_2_ = uVar108;
  uVar63 = *(ulong *)(prim + uVar63 + 6);
  uVar108 = (undefined2)(uVar63 >> 0x30);
  auVar87._8_4_ = 0;
  auVar87._0_8_ = uVar63;
  auVar87._12_2_ = uVar108;
  auVar87._14_2_ = uVar108;
  uVar108 = (undefined2)(uVar63 >> 0x20);
  auVar86._12_4_ = auVar87._12_4_;
  auVar86._8_2_ = 0;
  auVar86._0_8_ = uVar63;
  auVar86._10_2_ = uVar108;
  auVar85._10_6_ = auVar86._10_6_;
  auVar85._8_2_ = uVar108;
  auVar85._0_8_ = uVar63;
  uVar108 = (undefined2)(uVar63 >> 0x10);
  auVar46._4_8_ = auVar85._8_8_;
  auVar46._2_2_ = uVar108;
  auVar46._0_2_ = uVar108;
  fVar161 = (float)(auVar46._0_4_ >> 0x10);
  fVar210 = (float)(auVar85._8_4_ >> 0x10);
  uVar15 = *(ulong *)(prim + uVar56 * 0x18 + 6);
  uVar108 = (undefined2)(uVar15 >> 0x30);
  auVar238._8_4_ = 0;
  auVar238._0_8_ = uVar15;
  auVar238._12_2_ = uVar108;
  auVar238._14_2_ = uVar108;
  uVar108 = (undefined2)(uVar15 >> 0x20);
  auVar237._12_4_ = auVar238._12_4_;
  auVar237._8_2_ = 0;
  auVar237._0_8_ = uVar15;
  auVar237._10_2_ = uVar108;
  auVar236._10_6_ = auVar237._10_6_;
  auVar236._8_2_ = uVar108;
  auVar236._0_8_ = uVar15;
  uVar108 = (undefined2)(uVar15 >> 0x10);
  auVar47._4_8_ = auVar236._8_8_;
  auVar47._2_2_ = uVar108;
  auVar47._0_2_ = uVar108;
  uVar16 = *(ulong *)(prim + uVar56 * 0x1d + 6);
  uVar108 = (undefined2)(uVar16 >> 0x30);
  auVar90._8_4_ = 0;
  auVar90._0_8_ = uVar16;
  auVar90._12_2_ = uVar108;
  auVar90._14_2_ = uVar108;
  uVar108 = (undefined2)(uVar16 >> 0x20);
  auVar89._12_4_ = auVar90._12_4_;
  auVar89._8_2_ = 0;
  auVar89._0_8_ = uVar16;
  auVar89._10_2_ = uVar108;
  auVar88._10_6_ = auVar89._10_6_;
  auVar88._8_2_ = uVar108;
  auVar88._0_8_ = uVar16;
  uVar108 = (undefined2)(uVar16 >> 0x10);
  auVar48._4_8_ = auVar88._8_8_;
  auVar48._2_2_ = uVar108;
  auVar48._0_2_ = uVar108;
  fVar177 = (float)(auVar48._0_4_ >> 0x10);
  fVar214 = (float)(auVar88._8_4_ >> 0x10);
  uVar17 = *(ulong *)(prim + uVar56 + (ulong)(byte)PVar19 * 0x20 + 6);
  uVar108 = (undefined2)(uVar17 >> 0x30);
  auVar247._8_4_ = 0;
  auVar247._0_8_ = uVar17;
  auVar247._12_2_ = uVar108;
  auVar247._14_2_ = uVar108;
  uVar108 = (undefined2)(uVar17 >> 0x20);
  auVar246._12_4_ = auVar247._12_4_;
  auVar246._8_2_ = 0;
  auVar246._0_8_ = uVar17;
  auVar246._10_2_ = uVar108;
  auVar245._10_6_ = auVar246._10_6_;
  auVar245._8_2_ = uVar108;
  auVar245._0_8_ = uVar17;
  uVar108 = (undefined2)(uVar17 >> 0x10);
  auVar49._4_8_ = auVar245._8_8_;
  auVar49._2_2_ = uVar108;
  auVar49._0_2_ = uVar108;
  uVar18 = *(ulong *)(prim + ((ulong)(byte)PVar19 * 0x20 - uVar56) + 6);
  uVar108 = (undefined2)(uVar18 >> 0x30);
  auVar93._8_4_ = 0;
  auVar93._0_8_ = uVar18;
  auVar93._12_2_ = uVar108;
  auVar93._14_2_ = uVar108;
  uVar108 = (undefined2)(uVar18 >> 0x20);
  auVar92._12_4_ = auVar93._12_4_;
  auVar92._8_2_ = 0;
  auVar92._0_8_ = uVar18;
  auVar92._10_2_ = uVar108;
  auVar91._10_6_ = auVar92._10_6_;
  auVar91._8_2_ = uVar108;
  auVar91._0_8_ = uVar18;
  uVar108 = (undefined2)(uVar18 >> 0x10);
  auVar50._4_8_ = auVar91._8_8_;
  auVar50._2_2_ = uVar108;
  auVar50._0_2_ = uVar108;
  fVar178 = (float)(auVar50._0_4_ >> 0x10);
  fVar215 = (float)(auVar91._8_4_ >> 0x10);
  uVar56 = *(ulong *)(prim + uVar56 * 0x23 + 6);
  uVar108 = (undefined2)(uVar56 >> 0x30);
  auVar261._8_4_ = 0;
  auVar261._0_8_ = uVar56;
  auVar261._12_2_ = uVar108;
  auVar261._14_2_ = uVar108;
  uVar108 = (undefined2)(uVar56 >> 0x20);
  auVar260._12_4_ = auVar261._12_4_;
  auVar260._8_2_ = 0;
  auVar260._0_8_ = uVar56;
  auVar260._10_2_ = uVar108;
  auVar259._10_6_ = auVar260._10_6_;
  auVar259._8_2_ = uVar108;
  auVar259._0_8_ = uVar56;
  uVar108 = (undefined2)(uVar56 >> 0x10);
  auVar51._4_8_ = auVar259._8_8_;
  auVar51._2_2_ = uVar108;
  auVar51._0_2_ = uVar108;
  auVar166._0_8_ =
       CONCAT44(((((float)(auVar41._0_4_ >> 0x10) - fVar144) * fVar240 + fVar144) - fVar282) *
                fVar110,((((float)(int)(short)uVar61 - (float)(int)(short)uVar58) * fVar240 +
                         (float)(int)(short)uVar58) - fVar275) * fVar160);
  auVar166._8_4_ =
       ((((float)(auVar163._8_4_ >> 0x10) - fVar187) * fVar240 + fVar187) - fVar284) * fVar179;
  auVar166._12_4_ =
       ((((float)(auVar164._12_4_ >> 0x10) - (float)(auVar77._12_4_ >> 0x10)) * fVar240 +
        (float)(auVar77._12_4_ >> 0x10)) - fVar286) * fVar216;
  auVar221._0_4_ =
       ((((float)(int)(short)uVar12 - (float)(int)(short)uVar11) * fVar240 +
        (float)(int)(short)uVar11) - fVar275) * fVar160;
  auVar221._4_4_ =
       ((((float)(auVar43._0_4_ >> 0x10) - fVar149) * fVar240 + fVar149) - fVar282) * fVar110;
  auVar221._8_4_ =
       ((((float)(auVar218._8_4_ >> 0x10) - fVar208) * fVar240 + fVar208) - fVar284) * fVar179;
  auVar221._12_4_ =
       ((((float)(auVar219._12_4_ >> 0x10) - (float)(auVar80._12_4_ >> 0x10)) * fVar240 +
        (float)(auVar80._12_4_ >> 0x10)) - fVar286) * fVar216;
  auVar232._0_8_ =
       CONCAT44(((((float)(auVar45._0_4_ >> 0x10) - fVar159) * fVar240 + fVar159) - fVar233) *
                fVar111,((((float)(int)(short)uVar14 - (float)(int)(short)uVar13) * fVar240 +
                         (float)(int)(short)uVar13) - fVar228) * fVar73);
  auVar232._8_4_ =
       ((((float)(auVar229._8_4_ >> 0x10) - fVar209) * fVar240 + fVar209) - fVar234) * fVar185;
  auVar232._12_4_ =
       ((((float)(auVar230._12_4_ >> 0x10) - (float)(auVar83._12_4_ >> 0x10)) * fVar240 +
        (float)(auVar83._12_4_ >> 0x10)) - fVar274) * fVar222;
  auVar239._0_4_ =
       ((((float)(int)(short)uVar15 - (float)(int)(short)uVar63) * fVar240 +
        (float)(int)(short)uVar63) - fVar228) * fVar73;
  auVar239._4_4_ =
       ((((float)(auVar47._0_4_ >> 0x10) - fVar161) * fVar240 + fVar161) - fVar233) * fVar111;
  auVar239._8_4_ =
       ((((float)(auVar236._8_4_ >> 0x10) - fVar210) * fVar240 + fVar210) - fVar234) * fVar185;
  auVar239._12_4_ =
       ((((float)(auVar237._12_4_ >> 0x10) - (float)(auVar86._12_4_ >> 0x10)) * fVar240 +
        (float)(auVar86._12_4_ >> 0x10)) - fVar274) * fVar222;
  auVar248._0_8_ =
       CONCAT44(((((float)(auVar49._0_4_ >> 0x10) - fVar177) * fVar240 + fVar177) - fVar226) *
                fVar141,((((float)(int)(short)uVar17 - (float)(int)(short)uVar16) * fVar240 +
                         (float)(int)(short)uVar16) - fVar224) * fVar109);
  auVar248._8_4_ =
       ((((float)(auVar245._8_4_ >> 0x10) - fVar214) * fVar240 + fVar214) - fVar227) * fVar186;
  auVar248._12_4_ =
       ((((float)(auVar246._12_4_ >> 0x10) - (float)(auVar89._12_4_ >> 0x10)) * fVar240 +
        (float)(auVar89._12_4_ >> 0x10)) - fVar235) * fVar223;
  auVar262._0_4_ =
       ((((float)(int)(short)uVar56 - (float)(int)(short)uVar18) * fVar240 +
        (float)(int)(short)uVar18) - fVar224) * fVar109;
  auVar262._4_4_ =
       ((((float)(auVar51._0_4_ >> 0x10) - fVar178) * fVar240 + fVar178) - fVar226) * fVar141;
  auVar262._8_4_ =
       ((((float)(auVar259._8_4_ >> 0x10) - fVar215) * fVar240 + fVar215) - fVar227) * fVar186;
  auVar262._12_4_ =
       ((((float)(auVar260._12_4_ >> 0x10) - (float)(auVar92._12_4_ >> 0x10)) * fVar240 +
        (float)(auVar92._12_4_ >> 0x10)) - fVar235) * fVar223;
  auVar150._8_4_ = auVar166._8_4_;
  auVar150._0_8_ = auVar166._0_8_;
  auVar150._12_4_ = auVar166._12_4_;
  auVar151 = minps(auVar150,auVar221);
  auVar94._8_4_ = auVar232._8_4_;
  auVar94._0_8_ = auVar232._0_8_;
  auVar94._12_4_ = auVar232._12_4_;
  auVar75 = minps(auVar94,auVar239);
  auVar151 = maxps(auVar151,auVar75);
  auVar95._8_4_ = auVar248._8_4_;
  auVar95._0_8_ = auVar248._0_8_;
  auVar95._12_4_ = auVar248._12_4_;
  auVar75 = minps(auVar95,auVar262);
  uVar54 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar123._4_4_ = uVar54;
  auVar123._0_4_ = uVar54;
  auVar123._8_4_ = uVar54;
  auVar123._12_4_ = uVar54;
  auVar75 = maxps(auVar75,auVar123);
  auVar75 = maxps(auVar151,auVar75);
  local_48 = auVar75._0_4_ * 0.99999964;
  fStack_44 = auVar75._4_4_ * 0.99999964;
  fStack_40 = auVar75._8_4_ * 0.99999964;
  fStack_3c = auVar75._12_4_ * 0.99999964;
  auVar75 = maxps(auVar166,auVar221);
  auVar151 = maxps(auVar232,auVar239);
  auVar75 = minps(auVar75,auVar151);
  auVar151 = maxps(auVar248,auVar262);
  fVar160 = (ray->super_RayK<1>).tfar;
  auVar96._4_4_ = fVar160;
  auVar96._0_4_ = fVar160;
  auVar96._8_4_ = fVar160;
  auVar96._12_4_ = fVar160;
  auVar151 = minps(auVar151,auVar96);
  auVar75 = minps(auVar75,auVar151);
  uVar66 = (uint)(byte)PVar19;
  auVar124._0_4_ = -(uint)(uVar66 != 0 && local_48 <= auVar75._0_4_ * 1.0000004);
  auVar124._4_4_ = -(uint)(1 < uVar66 && fStack_44 <= auVar75._4_4_ * 1.0000004);
  auVar124._8_4_ = -(uint)(2 < uVar66 && fStack_40 <= auVar75._8_4_ * 1.0000004);
  auVar124._12_4_ = -(uint)(3 < uVar66 && fStack_3c <= auVar75._12_4_ * 1.0000004);
  uVar66 = movmskps(uVar66,auVar124);
  if (uVar66 != 0) {
    uVar66 = uVar66 & 0xff;
    local_2d8 = mm_lookupmask_ps._0_8_;
    uStack_2d0 = mm_lookupmask_ps._8_8_;
    local_320 = pre;
    local_170 = prim;
    do {
      lVar23 = 0;
      if (uVar66 != 0) {
        for (; (uVar66 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
        }
      }
      local_3e0 = (RTCIntersectArguments *)(ulong)*(uint *)(local_170 + 2);
      local_3c0 = (ulong)*(uint *)(local_170 + lVar23 * 4 + 6);
      pGVar21 = (context->scene->geometries).items[(long)local_3e0].ptr;
      uVar58 = (ulong)*(uint *)(*(long *)&pGVar21->field_0x58 +
                               local_3c0 *
                               pGVar21[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      local_408 = pGVar21->fnumTimeSegments;
      fVar160 = (pGVar21->time_range).lower;
      fVar160 = (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar160) /
                ((pGVar21->time_range).upper - fVar160)) * pGVar21->fnumTimeSegments;
      _local_3f8 = ZEXT416((uint)fVar160);
      fVar160 = floorf(fVar160);
      if (local_408 + -1.0 <= fVar160) {
        fVar160 = local_408 + -1.0;
      }
      fVar73 = 0.0;
      if (0.0 <= fVar160) {
        fVar73 = fVar160;
      }
      _Var22 = pGVar21[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      uVar61 = (long)(int)fVar73 * 0x38;
      lVar23 = *(long *)(_Var22 + 0x10 + uVar61);
      lVar65 = *(long *)(_Var22 + 0x38 + uVar61);
      lVar64 = *(long *)(_Var22 + 0x48 + uVar61);
      pfVar1 = (float *)(lVar65 + uVar58 * lVar64);
      pfVar2 = (float *)(lVar65 + (uVar58 + 1) * lVar64);
      pfVar3 = (float *)(lVar65 + (uVar58 + 2) * lVar64);
      fVar73 = (float)local_3f8._0_4_ - fVar73;
      fVar160 = 1.0 - fVar73;
      pfVar4 = (float *)(lVar65 + lVar64 * (uVar58 + 3));
      lVar65 = *(long *)(_Var22 + uVar61);
      pfVar5 = (float *)(lVar65 + lVar23 * uVar58);
      pfVar6 = (float *)(lVar65 + lVar23 * (uVar58 + 1));
      local_2a8 = *pfVar5 * fVar160 + *pfVar1 * fVar73;
      fStack_2a4 = pfVar5[1] * fVar160 + pfVar1[1] * fVar73;
      fStack_2a0 = pfVar5[2] * fVar160 + pfVar1[2] * fVar73;
      fStack_29c = pfVar5[3] * fVar160 + pfVar1[3] * fVar73;
      local_2b8 = *pfVar6 * fVar160 + *pfVar2 * fVar73;
      fStack_2b4 = pfVar6[1] * fVar160 + pfVar2[1] * fVar73;
      fStack_2b0 = pfVar6[2] * fVar160 + pfVar2[2] * fVar73;
      fStack_2ac = pfVar6[3] * fVar160 + pfVar2[3] * fVar73;
      pfVar1 = (float *)(lVar65 + lVar23 * (uVar58 + 2));
      pfVar2 = (float *)(lVar65 + lVar23 * (uVar58 + 3));
      local_2c8 = *pfVar1 * fVar160 + *pfVar3 * fVar73;
      fStack_2c4 = pfVar1[1] * fVar160 + pfVar3[1] * fVar73;
      fStack_2c0 = pfVar1[2] * fVar160 + pfVar3[2] * fVar73;
      fStack_2bc = pfVar1[3] * fVar160 + pfVar3[3] * fVar73;
      local_298 = fVar160 * *pfVar2 + fVar73 * *pfVar4;
      fStack_294 = fVar160 * pfVar2[1] + fVar73 * pfVar4[1];
      fStack_290 = fVar160 * pfVar2[2] + fVar73 * pfVar4[2];
      fStack_28c = fVar160 * pfVar2[3] + fVar73 * pfVar4[3];
      local_208 = (ray->super_RayK<1>).org.field_0.m128[0];
      fStack_204 = (ray->super_RayK<1>).org.field_0.m128[1];
      fStack_200 = (ray->super_RayK<1>).org.field_0.m128[2];
      fStack_1fc = (ray->super_RayK<1>).org.field_0.m128[3];
      fVar161 = local_2a8 - local_208;
      fVar177 = fStack_2a4 - fStack_204;
      fVar178 = fStack_2a0 - fStack_200;
      fVar160 = (local_320->ray_space).vx.field_0.m128[0];
      fVar73 = (local_320->ray_space).vx.field_0.m128[1];
      fVar109 = (local_320->ray_space).vx.field_0.m128[2];
      fVar110 = (local_320->ray_space).vy.field_0.m128[0];
      fVar111 = (local_320->ray_space).vy.field_0.m128[1];
      fVar141 = (local_320->ray_space).vy.field_0.m128[2];
      fVar144 = (local_320->ray_space).vz.field_0.m128[0];
      fVar149 = (local_320->ray_space).vz.field_0.m128[1];
      fVar159 = (local_320->ray_space).vz.field_0.m128[2];
      local_188 = fVar161 * fVar160 + fVar177 * fVar110 + fVar178 * fVar144;
      local_198 = fVar161 * fVar73 + fVar177 * fVar111 + fVar178 * fVar149;
      local_3f8._4_4_ = fVar161 * fVar109 + fVar177 * fVar141 + fVar178 * fVar159;
      fVar161 = local_2b8 - local_208;
      fVar177 = fStack_2b4 - fStack_204;
      fVar178 = fStack_2b0 - fStack_200;
      aStack_44c.field_0.y = fVar161 * fVar160 + fVar177 * fVar110 + fVar178 * fVar144;
      aStack_46c.m128[1] = fVar161 * fVar73 + fVar177 * fVar111 + fVar178 * fVar149;
      local_258 = fVar161 * fVar109 + fVar177 * fVar141 + fVar178 * fVar159;
      fVar177 = local_2c8 - local_208;
      fVar178 = fStack_2c4 - fStack_204;
      fVar179 = fStack_2c0 - fStack_200;
      local_3b8 = fVar177 * fVar160 + fVar178 * fVar110 + fVar179 * fVar144;
      fVar161 = fVar177 * fVar73 + fVar178 * fVar111 + fVar179 * fVar149;
      local_268 = fVar177 * fVar109 + fVar178 * fVar141 + fVar179 * fVar159;
      fVar177 = local_298 - local_208;
      fVar178 = fStack_294 - fStack_204;
      fVar179 = fStack_290 - fStack_200;
      iVar20 = (int)pGVar21[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      local_438 = fVar177 * fVar160 + fVar178 * fVar110 + fVar179 * fVar144;
      fVar73 = fVar177 * fVar73 + fVar178 * fVar111 + fVar179 * fVar149;
      fVar109 = fVar177 * fVar109 + fVar178 * fVar141 + fVar179 * fVar159;
      fStack_40c = fVar177 * (local_320->ray_space).vx.field_0.m128[3] +
                   fVar178 * (local_320->ray_space).vy.field_0.m128[3] +
                   fVar179 * (local_320->ray_space).vz.field_0.m128[3];
      auVar263._0_8_ = CONCAT44(local_198,local_188) & 0x7fffffff7fffffff;
      auVar263._8_4_ = ABS((float)local_3f8._4_4_);
      auVar263._12_4_ = ABS(fStack_29c);
      auVar167._0_8_ = CONCAT44(aStack_46c.m128[1],aStack_44c.field_0.y) & 0x7fffffff7fffffff;
      auVar167._8_4_ = ABS(local_258);
      auVar167._12_4_ = ABS(fStack_2ac);
      auVar151 = maxps(auVar263,auVar167);
      auVar180._0_8_ = CONCAT44(fVar161,local_3b8) & 0x7fffffff7fffffff;
      auVar180._8_4_ = ABS(local_268);
      auVar180._12_4_ = ABS(fStack_2bc);
      auVar125._0_8_ = CONCAT44(fVar73,local_438) & 0x7fffffff7fffffff;
      auVar125._8_4_ = ABS(fVar109);
      auVar125._12_4_ = ABS(fStack_28c);
      auVar75 = maxps(auVar180,auVar125);
      auVar75 = maxps(auVar151,auVar75);
      fVar160 = auVar75._4_4_;
      if (auVar75._4_4_ <= auVar75._0_4_) {
        fVar160 = auVar75._0_4_;
      }
      fVar110 = (float)iVar20;
      auVar264._8_8_ = auVar75._8_8_;
      auVar264._0_8_ = auVar75._8_8_;
      if (auVar75._8_4_ <= fVar160) {
        auVar264._0_4_ = fVar160;
      }
      _local_218 = ZEXT416((uint)fVar110);
      local_288 = (float)-(uint)(0.0 < fVar110);
      fStack_284 = (float)-(uint)(1.0 < fVar110);
      fStack_280 = (float)-(uint)(2.0 < fVar110);
      fStack_27c = (float)-(uint)(3.0 < fVar110);
      iVar59 = iVar20 * 0x40;
      lVar23 = (long)iVar20 * 0x44;
      fStack_3b4 = local_3b8;
      fStack_3b0 = local_3b8;
      fStack_3ac = local_3b8;
      fVar160 = *(float *)*(undefined1 (*) [12])(bezier_basis0 + lVar23 + 0xd8c);
      fVar111 = *(float *)(bezier_basis0 + lVar23 + 0xd90);
      fVar141 = *(float *)(bezier_basis0 + lVar23 + 0xd94);
      auVar31 = *(undefined1 (*) [12])(bezier_basis0 + lVar23 + 0xd8c);
      fVar144 = *(float *)(bezier_basis0 + lVar23 + 0xd98);
      fStack_434 = local_438;
      auStack_430[0] = (uint)local_438;
      auStack_42c[0] = (uint)local_438;
      local_378 = *(float *)(bezier_basis0 + lVar23 + 0x908);
      fStack_374 = *(float *)(bezier_basis0 + lVar23 + 0x90c);
      fStack_370 = *(float *)(bezier_basis0 + lVar23 + 0x910);
      fStack_36c = *(float *)(bezier_basis0 + lVar23 + 0x914);
      local_458 = fVar161;
      fStack_454 = fVar161;
      fStack_450 = fVar161;
      aStack_44c.field_0.x = fVar161;
      local_428 = fVar73;
      fStack_424 = fVar73;
      fStack_420 = fVar73;
      fStack_41c = fVar73;
      local_388 = *(float *)(bezier_basis0 + lVar23 + 0x484);
      fStack_384 = *(float *)(bezier_basis0 + lVar23 + 0x488);
      fStack_380 = *(float *)(bezier_basis0 + lVar23 + 0x48c);
      fStack_37c = *(float *)(bezier_basis0 + lVar23 + 0x490);
      pauVar7 = (undefined1 (*) [16])(bezier_basis0 + lVar23);
      fVar149 = *(float *)*pauVar7;
      fVar159 = *(float *)(bezier_basis0 + lVar23 + 4);
      fVar177 = *(float *)(bezier_basis0 + lVar23 + 8);
      auVar32 = *(undefined1 (*) [12])*pauVar7;
      fVar178 = *(float *)(bezier_basis0 + lVar23 + 0xc);
      local_278 = local_188 * fVar149 +
                  aStack_44c.field_0.y * local_388 + local_3b8 * local_378 + local_438 * fVar160;
      fStack_274 = local_188 * fVar159 +
                   aStack_44c.field_0.y * fStack_384 + local_3b8 * fStack_374 + local_438 * fVar111;
      fStack_270 = local_188 * fVar177 +
                   aStack_44c.field_0.y * fStack_380 + local_3b8 * fStack_370 + local_438 * fVar141;
      fStack_26c = local_188 * fVar178 +
                   aStack_44c.field_0.y * fStack_37c + local_3b8 * fStack_36c + local_438 * fVar144;
      local_1a8 = local_198 * fVar149 +
                  aStack_46c.m128[1] * local_388 + fVar161 * local_378 + fVar73 * fVar160;
      fStack_1a4 = local_198 * fVar159 +
                   aStack_46c.m128[1] * fStack_384 + fVar161 * fStack_374 + fVar73 * fVar111;
      fStack_1a0 = local_198 * fVar177 +
                   aStack_46c.m128[1] * fStack_380 + fVar161 * fStack_370 + fVar73 * fVar141;
      fStack_19c = local_198 * fVar178 +
                   aStack_46c.m128[1] * fStack_37c + fVar161 * fStack_36c + fVar73 * fVar144;
      _local_1c8 = *pauVar7;
      local_368._0_4_ =
           fStack_29c * fVar149 +
           fStack_2ac * local_388 + fStack_2bc * local_378 + fStack_28c * fVar160;
      local_368._4_4_ =
           fStack_29c * fVar159 +
           fStack_2ac * fStack_384 + fStack_2bc * fStack_374 + fStack_28c * fVar111;
      local_368._8_4_ =
           fStack_29c * fVar177 +
           fStack_2ac * fStack_380 + fStack_2bc * fStack_370 + fStack_28c * fVar141;
      local_368._12_4_ =
           fStack_29c * fVar178 +
           fStack_2ac * fStack_37c + fStack_2bc * fStack_36c + fStack_28c * fVar144;
      fVar160 = *(float *)(bezier_basis1 + lVar23 + 0xd8c);
      fVar111 = *(float *)(bezier_basis1 + lVar23 + 0xd90);
      unique0x10004c0b = *(undefined8 *)(bezier_basis1 + lVar23 + 0xd8c);
      uStack_470 = *(undefined4 *)(bezier_basis1 + lVar23 + 0xd94);
      aStack_46c.m128[0] = (float)*(undefined4 *)(bezier_basis1 + lVar23 + 0xd98);
      local_1d8 = *(float *)(bezier_basis1 + lVar23 + 0x908);
      fStack_1d4 = *(float *)(bezier_basis1 + lVar23 + 0x90c);
      fStack_1d0 = *(float *)(bezier_basis1 + lVar23 + 0x910);
      fStack_1cc = *(float *)(bezier_basis1 + lVar23 + 0x914);
      local_58 = fStack_28c;
      fStack_54 = fStack_28c;
      fStack_50 = fStack_28c;
      fStack_4c = fStack_28c;
      local_88 = fStack_2bc;
      fStack_84 = fStack_2bc;
      fStack_80 = fStack_2bc;
      fStack_7c = fStack_2bc;
      fVar141 = *(float *)(bezier_basis1 + lVar23 + 0x484);
      fVar149 = *(float *)(bezier_basis1 + lVar23 + 0x488);
      fVar159 = *(float *)(bezier_basis1 + lVar23 + 0x48c);
      fVar177 = *(float *)(bezier_basis1 + lVar23 + 0x490);
      aStack_44c.field_0.z = aStack_44c.field_0.y;
      fStack_440 = aStack_44c.field_0.y;
      fStack_43c = aStack_44c.field_0.y;
      aStack_46c.m128[2] = aStack_46c.m128[1];
      aStack_46c.m128[3] = aStack_46c.m128[1];
      fStack_45c = aStack_46c.m128[1];
      local_98 = fStack_2ac;
      fStack_94 = fStack_2ac;
      fStack_90 = fStack_2ac;
      fStack_8c = fStack_2ac;
      fVar179 = *(float *)(bezier_basis1 + lVar23);
      fVar185 = *(float *)(bezier_basis1 + lVar23 + 4);
      fVar186 = *(float *)(bezier_basis1 + lVar23 + 8);
      fVar187 = *(float *)(bezier_basis1 + lVar23 + 0xc);
      fStack_184 = local_188;
      fStack_180 = local_188;
      fStack_17c = local_188;
      fVar226 = local_188 * fVar179 +
                aStack_44c.field_0.y * fVar141 + local_3b8 * local_1d8 + local_438 * fVar160;
      fVar235 = local_188 * fVar185 +
                aStack_44c.field_0.y * fVar149 + local_3b8 * fStack_1d4 + local_438 * fVar111;
      fVar241 = local_188 * fVar186 +
                aStack_44c.field_0.y * fVar159 +
                local_3b8 * fStack_1d0 + local_438 * (float)uStack_470;
      fVar250 = local_188 * fVar187 +
                aStack_44c.field_0.y * fVar177 +
                local_3b8 * fStack_1cc + local_438 * aStack_46c.m128[0];
      fStack_194 = local_198;
      fStack_190 = local_198;
      fStack_18c = local_198;
      local_3a8._0_4_ =
           local_198 * fVar179 +
           aStack_46c.m128[1] * fVar141 + fVar161 * local_1d8 + fVar73 * fVar160;
      local_3a8._4_4_ =
           local_198 * fVar185 +
           aStack_46c.m128[1] * fVar149 + fVar161 * fStack_1d4 + fVar73 * fVar111;
      fStack_3a0 = local_198 * fVar186 +
                   aStack_46c.m128[1] * fVar159 + fVar161 * fStack_1d0 + fVar73 * (float)uStack_470;
      fStack_39c = local_198 * fVar187 +
                   aStack_46c.m128[1] * fVar177 + fVar161 * fStack_1cc + fVar73 * aStack_46c.m128[0]
      ;
      local_a8 = fStack_29c;
      fStack_a4 = fStack_29c;
      fStack_a0 = fStack_29c;
      fStack_9c = fStack_29c;
      fVar254 = fStack_29c * fVar179 +
                fStack_2ac * fVar141 + fStack_2bc * local_1d8 + fStack_28c * fVar160;
      fVar256 = fStack_29c * fVar185 +
                fStack_2ac * fVar149 + fStack_2bc * fStack_1d4 + fStack_28c * fVar111;
      fVar268 = fStack_29c * fVar186 +
                fStack_2ac * fVar159 + fStack_2bc * fStack_1d0 + fStack_28c * (float)uStack_470;
      fVar270 = fStack_29c * fVar187 +
                fStack_2ac * fVar177 + fStack_2bc * fStack_1cc + fStack_28c * aStack_46c.m128[0];
      local_3d8 = CONCAT44(fVar235,fVar226);
      uStack_3d0 = CONCAT44(fVar250,fVar241);
      fVar227 = fVar226 - local_278;
      fVar240 = fVar235 - fStack_274;
      fVar242 = fVar241 - fStack_270;
      fVar252 = fVar250 - fStack_26c;
      fVar233 = (float)local_3a8._0_4_ - local_1a8;
      fVar234 = (float)local_3a8._4_4_ - fStack_1a4;
      fVar274 = fStack_3a0 - fStack_1a0;
      fVar224 = fStack_39c - fStack_19c;
      fVar208 = local_1a8 * fVar227 - local_278 * fVar233;
      fVar209 = fStack_1a4 * fVar240 - fStack_274 * fVar234;
      fVar210 = fStack_1a0 * fVar242 - fStack_270 * fVar274;
      fVar214 = fStack_19c * fVar252 - fStack_26c * fVar224;
      auVar27._4_4_ = fVar256;
      auVar27._0_4_ = fVar254;
      auVar27._8_4_ = fVar268;
      auVar27._12_4_ = fVar270;
      auVar75 = maxps(local_368,auVar27);
      bVar24 = fVar208 * fVar208 <=
               auVar75._0_4_ * auVar75._0_4_ * (fVar227 * fVar227 + fVar233 * fVar233) &&
               0.0 < fVar110;
      local_1b8._0_4_ = -(uint)bVar24;
      bVar25 = fVar209 * fVar209 <=
               auVar75._4_4_ * auVar75._4_4_ * (fVar240 * fVar240 + fVar234 * fVar234) &&
               1.0 < fVar110;
      local_1b8._4_4_ = -(uint)bVar25;
      bVar26 = fVar210 * fVar210 <=
               auVar75._8_4_ * auVar75._8_4_ * (fVar242 * fVar242 + fVar274 * fVar274) &&
               2.0 < fVar110;
      fStack_1b0 = (float)-(uint)bVar26;
      bVar52 = fVar214 * fVar214 <=
               auVar75._12_4_ * auVar75._12_4_ * (fVar252 * fVar252 + fVar224 * fVar224) &&
               3.0 < fVar110;
      register0x0000134c = -(uint)bVar52;
      local_408 = auVar264._0_4_;
      fStack_404 = auVar264._4_4_;
      fStack_400 = auVar264._8_4_;
      fStack_3fc = auVar264._12_4_;
      fVar210 = local_408 * 4.7683716e-07;
      local_408 = fVar210;
      iVar53 = movmskps(iVar20,_local_1b8);
      local_3f8._0_4_ = local_3f8._4_4_;
      fStack_3f0 = (float)local_3f8._4_4_;
      fStack_3ec = (float)local_3f8._4_4_;
      fStack_254 = local_258;
      fStack_250 = local_258;
      fStack_24c = local_258;
      fStack_264 = local_268;
      fStack_260 = local_268;
      fStack_25c = local_268;
      fVar208 = fVar161;
      fVar209 = fVar161;
      uVar54 = fVar161;
      fVar214 = fVar73;
      fVar215 = fVar73;
      fVar216 = fVar73;
      fVar222 = fVar109;
      fVar223 = fVar109;
      fVar228 = fVar109;
      local_418 = local_438;
      fStack_414 = fVar73;
      fStack_410 = fVar109;
      if (iVar53 != 0) {
        local_47c._4_4_ =
             fVar160 * fVar109 + local_1d8 * local_268 + fVar141 * local_258 +
             fVar179 * (float)local_3f8._4_4_;
        fStack_474 = fVar111 * fVar109 + fStack_1d4 * local_268 + fVar149 * local_258 +
                     fVar185 * (float)local_3f8._4_4_;
        uStack_470 = (float)uStack_470 * fVar109 + fStack_1d0 * local_268 + fVar159 * local_258 +
                     fVar186 * (float)local_3f8._4_4_;
        aStack_46c.m128[0] =
             aStack_46c.m128[0] * fVar109 + fStack_1cc * local_268 + fVar177 * local_258 +
             fVar187 * (float)local_3f8._4_4_;
        local_1c8._0_4_ = auVar32._0_4_;
        local_1c8._4_4_ = auVar32._4_4_;
        fStack_1c0 = auVar32._8_4_;
        local_498._0_4_ = auVar31._0_4_;
        local_498._4_4_ = auVar31._4_4_;
        fStack_490 = auVar31._8_4_;
        fVar112 = (float)local_498._0_4_ * fVar109 + local_378 * local_268 + local_388 * local_258 +
                  (float)local_1c8._0_4_ * (float)local_3f8._4_4_;
        fVar142 = (float)local_498._4_4_ * fVar109 + fStack_374 * local_268 + fStack_384 * local_258
                  + (float)local_1c8._4_4_ * (float)local_3f8._4_4_;
        fVar145 = fStack_490 * fVar109 + fStack_370 * local_268 + fStack_380 * local_258 +
                  fStack_1c0 * (float)local_3f8._4_4_;
        fVar147 = fVar144 * fVar109 + fStack_36c * local_268 + fStack_37c * local_258 +
                  fVar178 * (float)local_3f8._4_4_;
        fVar160 = *(float *)(bezier_basis0 + lVar23 + 0x1210);
        fVar111 = *(float *)(bezier_basis0 + lVar23 + 0x1214);
        fVar141 = *(float *)(bezier_basis0 + lVar23 + 0x1218);
        fVar144 = *(float *)(bezier_basis0 + lVar23 + 0x121c);
        fVar149 = *(float *)(bezier_basis0 + lVar23 + 0x1694);
        fVar159 = *(float *)(bezier_basis0 + lVar23 + 0x1698);
        fVar177 = *(float *)(bezier_basis0 + lVar23 + 0x169c);
        fVar178 = *(float *)(bezier_basis0 + lVar23 + 0x16a0);
        fVar179 = *(float *)(bezier_basis0 + lVar23 + 0x1b18);
        fVar185 = *(float *)(bezier_basis0 + lVar23 + 0x1b1c);
        fVar186 = *(float *)(bezier_basis0 + lVar23 + 0x1b20);
        fVar187 = *(float *)(bezier_basis0 + lVar23 + 0x1b24);
        fVar272 = *(float *)(bezier_basis0 + lVar23 + 0x1f9c);
        fVar275 = *(float *)(bezier_basis0 + lVar23 + 0x1fa0);
        fVar282 = *(float *)(bezier_basis0 + lVar23 + 0x1fa4);
        fVar284 = *(float *)(bezier_basis0 + lVar23 + 0x1fa8);
        local_418 = fVar109;
        fStack_414 = fVar109;
        fStack_40c = fVar109;
        fVar243 = local_188 * fVar160 +
                  aStack_44c.field_0.y * fVar149 + local_3b8 * fVar179 + local_438 * fVar272;
        fVar251 = local_188 * fVar111 +
                  aStack_44c.field_0.y * fVar159 + local_3b8 * fVar185 + local_438 * fVar275;
        fVar253 = local_188 * fVar141 +
                  aStack_44c.field_0.y * fVar177 + local_3b8 * fVar186 + local_438 * fVar282;
        fVar255 = local_188 * fVar144 +
                  aStack_44c.field_0.y * fVar178 + local_3b8 * fVar187 + local_438 * fVar284;
        local_288 = fVar254;
        fStack_284 = fVar256;
        fStack_280 = fVar268;
        fStack_27c = fVar270;
        fVar295 = local_198 * fVar160 +
                  aStack_46c.m128[1] * fVar149 + fVar161 * fVar179 + fVar73 * fVar272;
        fVar298 = local_198 * fVar111 +
                  aStack_46c.m128[1] * fVar159 + fVar161 * fVar185 + fVar73 * fVar275;
        fVar301 = local_198 * fVar141 +
                  aStack_46c.m128[1] * fVar177 + fVar161 * fVar186 + fVar73 * fVar282;
        fVar304 = local_198 * fVar144 +
                  aStack_46c.m128[1] * fVar178 + fVar161 * fVar187 + fVar73 * fVar284;
        fVar286 = *(float *)(bezier_basis1 + lVar23 + 0x1210);
        fVar299 = *(float *)(bezier_basis1 + lVar23 + 0x1214);
        fVar302 = *(float *)(bezier_basis1 + lVar23 + 0x1218);
        fVar305 = *(float *)(bezier_basis1 + lVar23 + 0x121c);
        fVar257 = *(float *)(bezier_basis1 + lVar23 + 0x1b18);
        fVar269 = *(float *)(bezier_basis1 + lVar23 + 0x1b1c);
        fVar271 = *(float *)(bezier_basis1 + lVar23 + 0x1b20);
        fVar273 = *(float *)(bezier_basis1 + lVar23 + 0x1b24);
        fVar276 = *(float *)(bezier_basis1 + lVar23 + 0x1f9c);
        fVar283 = *(float *)(bezier_basis1 + lVar23 + 0x1fa0);
        fVar285 = *(float *)(bezier_basis1 + lVar23 + 0x1fa4);
        fVar287 = *(float *)(bezier_basis1 + lVar23 + 0x1fa8);
        fVar297 = *(float *)(bezier_basis1 + lVar23 + 0x1694);
        fVar300 = *(float *)(bezier_basis1 + lVar23 + 0x1698);
        fVar303 = *(float *)(bezier_basis1 + lVar23 + 0x169c);
        fVar296 = *(float *)(bezier_basis1 + lVar23 + 0x16a0);
        fVar288 = local_188 * fVar286 +
                  aStack_44c.field_0.y * fVar297 + local_3b8 * fVar257 + local_438 * fVar276;
        fVar292 = local_188 * fVar299 +
                  aStack_44c.field_0.y * fVar300 + local_3b8 * fVar269 + local_438 * fVar283;
        fVar293 = local_188 * fVar302 +
                  aStack_44c.field_0.y * fVar303 + local_3b8 * fVar271 + local_438 * fVar285;
        fVar294 = local_188 * fVar305 +
                  aStack_44c.field_0.y * fVar296 + local_3b8 * fVar273 + local_438 * fVar287;
        fVar113 = local_198 * fVar286 +
                  aStack_46c.m128[1] * fVar297 + fVar161 * fVar257 + fVar73 * fVar276;
        fVar143 = local_198 * fVar299 +
                  aStack_46c.m128[1] * fVar300 + fVar161 * fVar269 + fVar73 * fVar283;
        fVar146 = local_198 * fVar302 +
                  aStack_46c.m128[1] * fVar303 + fVar161 * fVar271 + fVar73 * fVar285;
        fVar148 = local_198 * fVar305 +
                  aStack_46c.m128[1] * fVar296 + fVar161 * fVar273 + fVar73 * fVar287;
        auVar265._0_8_ = CONCAT44(fVar251,fVar243) & 0x7fffffff7fffffff;
        auVar265._8_4_ = ABS(fVar253);
        auVar265._12_4_ = ABS(fVar255);
        auVar97._0_8_ = CONCAT44(fVar298,fVar295) & 0x7fffffff7fffffff;
        auVar97._8_4_ = ABS(fVar301);
        auVar97._12_4_ = ABS(fVar304);
        auVar75 = maxps(auVar265,auVar97);
        auVar277._0_8_ =
             CONCAT44(fVar111 * (float)local_3f8._4_4_ +
                      fVar159 * local_258 + fVar185 * local_268 + fVar275 * fVar109,
                      fVar160 * (float)local_3f8._4_4_ +
                      fVar149 * local_258 + fVar179 * local_268 + fVar272 * fVar109) &
             0x7fffffff7fffffff;
        auVar277._8_4_ =
             ABS(fVar141 * (float)local_3f8._4_4_ +
                 fVar177 * local_258 + fVar186 * local_268 + fVar282 * fVar109);
        auVar277._12_4_ =
             ABS(fVar144 * (float)local_3f8._4_4_ +
                 fVar178 * local_258 + fVar187 * local_268 + fVar284 * fVar109);
        auVar75 = maxps(auVar75,auVar277);
        uVar67 = -(uint)(fVar210 <= auVar75._0_4_);
        uVar68 = -(uint)(fVar210 <= auVar75._4_4_);
        uVar69 = -(uint)(fVar210 <= auVar75._8_4_);
        uVar70 = -(uint)(fVar210 <= auVar75._12_4_);
        fVar159 = (float)((uint)fVar243 & uVar67 | ~uVar67 & (uint)fVar227);
        fVar178 = (float)((uint)fVar251 & uVar68 | ~uVar68 & (uint)fVar240);
        fVar185 = (float)((uint)fVar253 & uVar69 | ~uVar69 & (uint)fVar242);
        fVar186 = (float)((uint)fVar255 & uVar70 | ~uVar70 & (uint)fVar252);
        fVar187 = (float)(~uVar67 & (uint)fVar233 | (uint)fVar295 & uVar67);
        fVar272 = (float)(~uVar68 & (uint)fVar234 | (uint)fVar298 & uVar68);
        fVar275 = (float)(~uVar69 & (uint)fVar274 | (uint)fVar301 & uVar69);
        fVar282 = (float)(~uVar70 & (uint)fVar224 | (uint)fVar304 & uVar70);
        auVar278._0_8_ = CONCAT44(fVar292,fVar288) & 0x7fffffff7fffffff;
        auVar278._8_4_ = ABS(fVar293);
        auVar278._12_4_ = ABS(fVar294);
        auVar225._0_8_ = CONCAT44(fVar143,fVar113) & 0x7fffffff7fffffff;
        auVar225._8_4_ = ABS(fVar146);
        auVar225._12_4_ = ABS(fVar148);
        auVar75 = maxps(auVar278,auVar225);
        auVar212._0_8_ =
             CONCAT44(fVar299 * (float)local_3f8._4_4_ +
                      fVar300 * local_258 + fVar269 * local_268 + fVar283 * fVar109,
                      fVar286 * (float)local_3f8._4_4_ +
                      fVar297 * local_258 + fVar257 * local_268 + fVar276 * fVar109) &
             0x7fffffff7fffffff;
        auVar212._8_4_ =
             ABS(fVar302 * (float)local_3f8._4_4_ +
                 fVar303 * local_258 + fVar271 * local_268 + fVar285 * fVar109);
        auVar212._12_4_ =
             ABS(fVar305 * (float)local_3f8._4_4_ +
                 fVar296 * local_258 + fVar273 * local_268 + fVar287 * fVar109);
        auVar75 = maxps(auVar75,auVar212);
        uVar67 = -(uint)(fVar210 <= auVar75._0_4_);
        uVar68 = -(uint)(fVar210 <= auVar75._4_4_);
        uVar69 = -(uint)(fVar210 <= auVar75._8_4_);
        uVar70 = -(uint)(fVar210 <= auVar75._12_4_);
        fVar284 = (float)((uint)fVar288 & uVar67 | ~uVar67 & (uint)fVar227);
        fVar297 = (float)((uint)fVar292 & uVar68 | ~uVar68 & (uint)fVar240);
        fVar300 = (float)((uint)fVar293 & uVar69 | ~uVar69 & (uint)fVar242);
        fVar303 = (float)((uint)fVar294 & uVar70 | ~uVar70 & (uint)fVar252);
        auVar126._0_4_ = (uint)fVar113 & uVar67;
        auVar126._4_4_ = (uint)fVar143 & uVar68;
        auVar126._8_4_ = (uint)fVar146 & uVar69;
        auVar126._12_4_ = (uint)fVar148 & uVar70;
        auVar279._0_4_ = ~uVar67 & (uint)fVar233;
        auVar279._4_4_ = ~uVar68 & (uint)fVar234;
        auVar279._8_4_ = ~uVar69 & (uint)fVar274;
        auVar279._12_4_ = ~uVar70 & (uint)fVar224;
        auVar279 = auVar279 | auVar126;
        auVar98._0_4_ = fVar187 * fVar187 + fVar159 * fVar159;
        auVar98._4_4_ = fVar272 * fVar272 + fVar178 * fVar178;
        auVar98._8_4_ = fVar275 * fVar275 + fVar185 * fVar185;
        auVar98._12_4_ = fVar282 * fVar282 + fVar186 * fVar186;
        auVar75 = rsqrtps(auVar126,auVar98);
        fVar160 = auVar75._0_4_;
        fVar111 = auVar75._4_4_;
        fVar141 = auVar75._8_4_;
        fVar144 = auVar75._12_4_;
        auVar127._0_4_ = fVar160 * fVar160 * auVar98._0_4_ * 0.5 * fVar160;
        auVar127._4_4_ = fVar111 * fVar111 * auVar98._4_4_ * 0.5 * fVar111;
        auVar127._8_4_ = fVar141 * fVar141 * auVar98._8_4_ * 0.5 * fVar141;
        auVar127._12_4_ = fVar144 * fVar144 * auVar98._12_4_ * 0.5 * fVar144;
        fVar286 = fVar160 * 1.5 - auVar127._0_4_;
        fVar299 = fVar111 * 1.5 - auVar127._4_4_;
        fVar302 = fVar141 * 1.5 - auVar127._8_4_;
        fVar305 = fVar144 * 1.5 - auVar127._12_4_;
        fVar233 = auVar279._0_4_;
        fVar234 = auVar279._4_4_;
        fVar274 = auVar279._8_4_;
        fVar224 = auVar279._12_4_;
        auVar99._0_4_ = fVar233 * fVar233 + fVar284 * fVar284;
        auVar99._4_4_ = fVar234 * fVar234 + fVar297 * fVar297;
        auVar99._8_4_ = fVar274 * fVar274 + fVar300 * fVar300;
        auVar99._12_4_ = fVar224 * fVar224 + fVar303 * fVar303;
        auVar75 = rsqrtps(auVar127,auVar99);
        fVar160 = auVar75._0_4_;
        fVar111 = auVar75._4_4_;
        fVar141 = auVar75._8_4_;
        fVar144 = auVar75._12_4_;
        fVar160 = fVar160 * 1.5 - fVar160 * fVar160 * auVar99._0_4_ * 0.5 * fVar160;
        fVar149 = fVar111 * 1.5 - fVar111 * fVar111 * auVar99._4_4_ * 0.5 * fVar111;
        fVar177 = fVar141 * 1.5 - fVar141 * fVar141 * auVar99._8_4_ * 0.5 * fVar141;
        fVar179 = fVar144 * 1.5 - fVar144 * fVar144 * auVar99._12_4_ * 0.5 * fVar144;
        fVar257 = fVar187 * fVar286 * local_368._0_4_;
        fVar269 = fVar272 * fVar299 * local_368._4_4_;
        fVar271 = fVar275 * fVar302 * local_368._8_4_;
        fVar273 = fVar282 * fVar305 * local_368._12_4_;
        fVar227 = -fVar159 * fVar286 * local_368._0_4_;
        fVar240 = -fVar178 * fVar299 * local_368._4_4_;
        fVar242 = -fVar185 * fVar302 * local_368._8_4_;
        fVar252 = -fVar186 * fVar305 * local_368._12_4_;
        local_388 = local_1a8 + fVar227;
        fStack_384 = fStack_1a4 + fVar240;
        fStack_380 = fStack_1a0 + fVar242;
        fStack_37c = fStack_19c + fVar252;
        fVar296 = fVar286 * 0.0 * local_368._0_4_;
        fVar113 = fVar299 * 0.0 * local_368._4_4_;
        fVar143 = fVar302 * 0.0 * local_368._8_4_;
        fVar146 = fVar305 * 0.0 * local_368._12_4_;
        local_378 = fVar112 + fVar296;
        fStack_374 = fVar142 + fVar113;
        fStack_370 = fVar145 + fVar143;
        fStack_36c = fVar147 + fVar146;
        fVar276 = fVar233 * fVar160 * fVar254;
        fVar283 = fVar234 * fVar149 * fVar256;
        fVar285 = fVar274 * fVar177 * fVar268;
        fVar287 = fVar224 * fVar179 * fVar270;
        fVar286 = fVar226 + fVar276;
        fVar299 = fVar235 + fVar283;
        fVar302 = fVar241 + fVar285;
        fVar305 = fVar250 + fVar287;
        fVar233 = -fVar284 * fVar160 * fVar254;
        fVar234 = -fVar297 * fVar149 * fVar256;
        fVar274 = -fVar300 * fVar177 * fVar268;
        fVar224 = -fVar303 * fVar179 * fVar270;
        fVar111 = (float)local_3a8._0_4_ + fVar233;
        fVar144 = (float)local_3a8._4_4_ + fVar234;
        fVar159 = fStack_3a0 + fVar274;
        fVar178 = fStack_39c + fVar224;
        fVar160 = fVar160 * 0.0 * fVar254;
        fVar141 = fVar149 * 0.0 * fVar256;
        fVar149 = fVar177 * 0.0 * fVar268;
        fVar177 = fVar179 * 0.0 * fVar270;
        fVar179 = local_278 - fVar257;
        fVar185 = fStack_274 - fVar269;
        fVar186 = fStack_270 - fVar271;
        fVar187 = fStack_26c - fVar273;
        fVar272 = (float)local_47c._4_4_ + fVar160;
        fVar275 = fStack_474 + fVar141;
        fVar282 = (float)uStack_470 + fVar149;
        fVar284 = aStack_46c.m128[0] + fVar177;
        fVar227 = local_1a8 - fVar227;
        fVar240 = fStack_1a4 - fVar240;
        fVar242 = fStack_1a0 - fVar242;
        fVar252 = fStack_19c - fVar252;
        fVar112 = fVar112 - fVar296;
        fVar142 = fVar142 - fVar113;
        fVar145 = fVar145 - fVar143;
        fVar147 = fVar147 - fVar146;
        uVar67 = -(uint)(0.0 < (fVar227 * (fVar272 - fVar112) - fVar112 * (fVar111 - fVar227)) * 0.0
                               + (fVar112 * (fVar286 - fVar179) - (fVar272 - fVar112) * fVar179) *
                                 0.0 + ((fVar111 - fVar227) * fVar179 -
                                       (fVar286 - fVar179) * fVar227));
        uVar68 = -(uint)(0.0 < (fVar240 * (fVar275 - fVar142) - fVar142 * (fVar144 - fVar240)) * 0.0
                               + (fVar142 * (fVar299 - fVar185) - (fVar275 - fVar142) * fVar185) *
                                 0.0 + ((fVar144 - fVar240) * fVar185 -
                                       (fVar299 - fVar185) * fVar240));
        uVar69 = -(uint)(0.0 < (fVar242 * (fVar282 - fVar145) - fVar145 * (fVar159 - fVar242)) * 0.0
                               + (fVar145 * (fVar302 - fVar186) - (fVar282 - fVar145) * fVar186) *
                                 0.0 + ((fVar159 - fVar242) * fVar186 -
                                       (fVar302 - fVar186) * fVar242));
        uVar70 = -(uint)(0.0 < (fVar252 * (fVar284 - fVar147) - fVar147 * (fVar178 - fVar252)) * 0.0
                               + (fVar147 * (fVar305 - fVar187) - (fVar284 - fVar147) * fVar187) *
                                 0.0 + ((fVar178 - fVar252) * fVar187 -
                                       (fVar305 - fVar187) * fVar252));
        fVar276 = (float)((uint)(fVar226 - fVar276) & uVar67 | ~uVar67 & (uint)(local_278 + fVar257)
                         );
        fVar283 = (float)((uint)(fVar235 - fVar283) & uVar68 |
                         ~uVar68 & (uint)(fStack_274 + fVar269));
        fVar285 = (float)((uint)(fVar241 - fVar285) & uVar69 |
                         ~uVar69 & (uint)(fStack_270 + fVar271));
        fVar287 = (float)((uint)(fVar250 - fVar287) & uVar70 |
                         ~uVar70 & (uint)(fStack_26c + fVar273));
        local_3a8._0_4_ =
             (uint)((float)local_3a8._0_4_ - fVar233) & uVar67 | ~uVar67 & (uint)local_388;
        local_3a8._4_4_ =
             (uint)((float)local_3a8._4_4_ - fVar234) & uVar68 | ~uVar68 & (uint)fStack_384;
        fStack_3a0 = (float)((uint)(fStack_3a0 - fVar274) & uVar69 | ~uVar69 & (uint)fStack_380);
        fStack_39c = (float)((uint)(fStack_39c - fVar224) & uVar70 | ~uVar70 & (uint)fStack_37c);
        fVar160 = (float)((uint)((float)local_47c._4_4_ - fVar160) & uVar67 |
                         ~uVar67 & (uint)local_378);
        fVar141 = (float)((uint)(fStack_474 - fVar141) & uVar68 | ~uVar68 & (uint)fStack_374);
        fVar149 = (float)((uint)((float)uStack_470 - fVar149) & uVar69 | ~uVar69 & (uint)fStack_370)
        ;
        fVar177 = (float)((uint)(aStack_46c.m128[0] - fVar177) & uVar70 | ~uVar70 & (uint)fStack_36c
                         );
        fVar233 = (float)((uint)fVar179 & uVar67 | ~uVar67 & (uint)fVar286);
        fVar234 = (float)((uint)fVar185 & uVar68 | ~uVar68 & (uint)fVar299);
        fVar274 = (float)((uint)fVar186 & uVar69 | ~uVar69 & (uint)fVar302);
        fVar224 = (float)((uint)fVar187 & uVar70 | ~uVar70 & (uint)fVar305);
        fVar226 = (float)((uint)fVar227 & uVar67 | ~uVar67 & (uint)fVar111);
        fVar235 = (float)((uint)fVar240 & uVar68 | ~uVar68 & (uint)fVar144);
        fVar241 = (float)((uint)fVar242 & uVar69 | ~uVar69 & (uint)fVar159);
        fVar250 = (float)((uint)fVar252 & uVar70 | ~uVar70 & (uint)fVar178);
        fVar257 = (float)((uint)fVar112 & uVar67 | ~uVar67 & (uint)fVar272);
        fVar269 = (float)((uint)fVar142 & uVar68 | ~uVar68 & (uint)fVar275);
        fVar271 = (float)((uint)fVar145 & uVar69 | ~uVar69 & (uint)fVar282);
        fVar273 = (float)((uint)fVar147 & uVar70 | ~uVar70 & (uint)fVar284);
        local_498._0_4_ = (float)((uint)fVar286 & uVar67 | ~uVar67 & (uint)fVar179) - fVar276;
        local_498._4_4_ = (float)((uint)fVar299 & uVar68 | ~uVar68 & (uint)fVar185) - fVar283;
        fStack_490 = (float)((uint)fVar302 & uVar69 | ~uVar69 & (uint)fVar186) - fVar285;
        fStack_48c = (float)((uint)fVar305 & uVar70 | ~uVar70 & (uint)fVar187) - fVar287;
        fVar179 = (float)((uint)fVar111 & uVar67 | ~uVar67 & (uint)fVar227) - (float)local_3a8._0_4_
        ;
        fVar185 = (float)((uint)fVar144 & uVar68 | ~uVar68 & (uint)fVar240) - (float)local_3a8._4_4_
        ;
        fVar186 = (float)((uint)fVar159 & uVar69 | ~uVar69 & (uint)fVar242) - fStack_3a0;
        fVar187 = (float)((uint)fVar178 & uVar70 | ~uVar70 & (uint)fVar252) - fStack_39c;
        fVar272 = (float)((uint)fVar272 & uVar67 | ~uVar67 & (uint)fVar112) - fVar160;
        fVar275 = (float)((uint)fVar275 & uVar68 | ~uVar68 & (uint)fVar142) - fVar141;
        fVar282 = (float)((uint)fVar282 & uVar69 | ~uVar69 & (uint)fVar145) - fVar149;
        fVar284 = (float)((uint)fVar284 & uVar70 | ~uVar70 & (uint)fVar147) - fVar177;
        fVar297 = fVar276 - fVar233;
        fVar300 = fVar283 - fVar234;
        fVar303 = fVar285 - fVar274;
        fVar296 = fVar287 - fVar224;
        fVar227 = (float)local_3a8._0_4_ - fVar226;
        fVar240 = (float)local_3a8._4_4_ - fVar235;
        fVar242 = fStack_3a0 - fVar241;
        fVar252 = fStack_39c - fVar250;
        local_3d8 = CONCAT44(fVar283,fVar276);
        uStack_3d0 = CONCAT44(fVar287,fVar285);
        fVar111 = fVar160 - fVar257;
        fVar144 = fVar141 - fVar269;
        fVar159 = fVar149 - fVar271;
        fVar178 = fVar177 - fVar273;
        fVar286 = ((float)local_3a8._0_4_ * fVar272 - fVar160 * fVar179) * 0.0 +
                  (fVar160 * (float)local_498._0_4_ - fVar276 * fVar272) * 0.0 +
                  (fVar276 * fVar179 - (float)local_3a8._0_4_ * (float)local_498._0_4_);
        fVar299 = ((float)local_3a8._4_4_ * fVar275 - fVar141 * fVar185) * 0.0 +
                  (fVar141 * (float)local_498._4_4_ - fVar283 * fVar275) * 0.0 +
                  (fVar283 * fVar185 - (float)local_3a8._4_4_ * (float)local_498._4_4_);
        auVar168._4_4_ = fVar299;
        auVar168._0_4_ = fVar286;
        fVar302 = (fStack_3a0 * fVar282 - fVar149 * fVar186) * 0.0 +
                  (fVar149 * fStack_490 - fVar285 * fVar282) * 0.0 +
                  (fVar285 * fVar186 - fStack_3a0 * fStack_490);
        fVar305 = (fStack_39c * fVar284 - fVar177 * fVar187) * 0.0 +
                  (fVar177 * fStack_48c - fVar287 * fVar284) * 0.0 +
                  (fVar287 * fVar187 - fStack_39c * fStack_48c);
        auVar289._0_4_ =
             (fVar226 * fVar111 - fVar257 * fVar227) * 0.0 +
             (fVar257 * fVar297 - fVar233 * fVar111) * 0.0 + (fVar233 * fVar227 - fVar226 * fVar297)
        ;
        auVar289._4_4_ =
             (fVar235 * fVar144 - fVar269 * fVar240) * 0.0 +
             (fVar269 * fVar300 - fVar234 * fVar144) * 0.0 + (fVar234 * fVar240 - fVar235 * fVar300)
        ;
        auVar289._8_4_ =
             (fVar241 * fVar159 - fVar271 * fVar242) * 0.0 +
             (fVar271 * fVar303 - fVar274 * fVar159) * 0.0 + (fVar274 * fVar242 - fVar241 * fVar303)
        ;
        auVar289._12_4_ =
             (fVar250 * fVar178 - fVar273 * fVar252) * 0.0 +
             (fVar273 * fVar296 - fVar224 * fVar178) * 0.0 + (fVar224 * fVar252 - fVar250 * fVar296)
        ;
        auVar168._8_4_ = fVar302;
        auVar168._12_4_ = fVar305;
        auVar75 = maxps(auVar168,auVar289);
        bVar24 = auVar75._0_4_ <= 0.0 && bVar24;
        auVar169._0_4_ = -(uint)bVar24;
        bVar25 = auVar75._4_4_ <= 0.0 && bVar25;
        auVar169._4_4_ = -(uint)bVar25;
        bVar26 = auVar75._8_4_ <= 0.0 && bVar26;
        auVar169._8_4_ = -(uint)bVar26;
        bVar52 = auVar75._12_4_ <= 0.0 && bVar52;
        auVar169._12_4_ = -(uint)bVar52;
        iVar53 = movmskps(iVar53,auVar169);
        if (iVar53 == 0) {
LAB_00ae3b5b:
          auVar170._8_8_ = uStack_2d0;
          auVar170._0_8_ = local_2d8;
        }
        else {
          fVar233 = (ray->super_RayK<1>).tfar;
          fVar235 = fVar227 * fVar272 - fVar111 * fVar179;
          fVar241 = fVar240 * fVar275 - fVar144 * fVar185;
          fVar250 = fVar242 * fVar282 - fVar159 * fVar186;
          fVar257 = fVar252 * fVar284 - fVar178 * fVar187;
          fVar234 = fVar111 * (float)local_498._0_4_ - fVar272 * fVar297;
          fVar274 = fVar144 * (float)local_498._4_4_ - fVar275 * fVar300;
          fVar224 = fVar159 * fStack_490 - fVar282 * fVar303;
          fVar226 = fVar178 * fStack_48c - fVar284 * fVar296;
          fVar179 = fVar297 * fVar179 - fVar227 * (float)local_498._0_4_;
          fVar185 = fVar300 * fVar185 - fVar240 * (float)local_498._4_4_;
          fVar186 = fVar303 * fVar186 - fVar242 * fStack_490;
          fVar187 = fVar296 * fVar187 - fVar252 * fStack_48c;
          auVar204._0_4_ = fVar235 * 0.0 + fVar234 * 0.0 + fVar179;
          auVar204._4_4_ = fVar241 * 0.0 + fVar274 * 0.0 + fVar185;
          auVar204._8_4_ = fVar250 * 0.0 + fVar224 * 0.0 + fVar186;
          auVar204._12_4_ = fVar257 * 0.0 + fVar226 * 0.0 + fVar187;
          auVar75 = rcpps(_local_498,auVar204);
          fVar111 = auVar75._0_4_;
          fVar144 = auVar75._4_4_;
          fVar159 = auVar75._8_4_;
          fVar178 = auVar75._12_4_;
          fVar111 = (1.0 - auVar204._0_4_ * fVar111) * fVar111 + fVar111;
          fVar144 = (1.0 - auVar204._4_4_ * fVar144) * fVar144 + fVar144;
          fVar159 = (1.0 - auVar204._8_4_ * fVar159) * fVar159 + fVar159;
          fVar178 = (1.0 - auVar204._12_4_ * fVar178) * fVar178 + fVar178;
          fVar160 = (fVar160 * fVar179 + (float)local_3a8._0_4_ * fVar234 + fVar276 * fVar235) *
                    fVar111;
          fVar141 = (fVar141 * fVar185 + (float)local_3a8._4_4_ * fVar274 + fVar283 * fVar241) *
                    fVar144;
          fVar149 = (fVar149 * fVar186 + fStack_3a0 * fVar224 + fVar285 * fVar250) * fVar159;
          fVar177 = (fVar177 * fVar187 + fStack_39c * fVar226 + fVar287 * fVar257) * fVar178;
          bVar24 = (fVar160 <= fVar233 && fStack_1fc <= fVar160) && bVar24;
          auVar100._0_4_ = -(uint)bVar24;
          bVar25 = (fVar141 <= fVar233 && fStack_1fc <= fVar141) && bVar25;
          auVar100._4_4_ = -(uint)bVar25;
          bVar26 = (fVar149 <= fVar233 && fStack_1fc <= fVar149) && bVar26;
          auVar100._8_4_ = -(uint)bVar26;
          bVar52 = (fVar177 <= fVar233 && fStack_1fc <= fVar177) && bVar52;
          auVar100._12_4_ = -(uint)bVar52;
          iVar53 = movmskps(iVar53,auVar100);
          if (iVar53 == 0) goto LAB_00ae3b5b;
          auVar101._0_8_ =
               CONCAT44(-(uint)(auVar204._4_4_ != 0.0 && bVar25),
                        -(uint)(auVar204._0_4_ != 0.0 && bVar24));
          auVar101._8_4_ = -(uint)(auVar204._8_4_ != 0.0 && bVar26);
          auVar101._12_4_ = -(uint)(auVar204._12_4_ != 0.0 && bVar52);
          iVar53 = movmskps(iVar53,auVar101);
          auVar170._8_8_ = uStack_2d0;
          auVar170._0_8_ = local_2d8;
          if (iVar53 != 0) {
            fVar286 = fVar286 * fVar111;
            fVar299 = fVar299 * fVar144;
            fVar302 = fVar302 * fVar159;
            fVar305 = fVar305 * fVar178;
            local_348 = (float)((uint)(1.0 - fVar286) & uVar67 | ~uVar67 & (uint)fVar286);
            fStack_344 = (float)((uint)(1.0 - fVar299) & uVar68 | ~uVar68 & (uint)fVar299);
            fStack_340 = (float)((uint)(1.0 - fVar302) & uVar69 | ~uVar69 & (uint)fVar302);
            fStack_33c = (float)((uint)(1.0 - fVar305) & uVar70 | ~uVar70 & (uint)fVar305);
            auVar170._8_4_ = auVar101._8_4_;
            auVar170._0_8_ = auVar101._0_8_;
            auVar170._12_4_ = auVar101._12_4_;
            local_1e8 = (float)(~uVar67 & (uint)(auVar289._0_4_ * fVar111) |
                               (uint)(1.0 - auVar289._0_4_ * fVar111) & uVar67);
            fStack_1e4 = (float)(~uVar68 & (uint)(auVar289._4_4_ * fVar144) |
                                (uint)(1.0 - auVar289._4_4_ * fVar144) & uVar68);
            fStack_1e0 = (float)(~uVar69 & (uint)(auVar289._8_4_ * fVar159) |
                                (uint)(1.0 - auVar289._8_4_ * fVar159) & uVar69);
            fStack_1dc = (float)(~uVar70 & (uint)(auVar289._12_4_ * fVar178) |
                                (uint)(1.0 - auVar289._12_4_ * fVar178) & uVar70);
            local_358 = fVar160;
            fStack_354 = fVar141;
            fStack_350 = fVar149;
            fStack_34c = fVar177;
          }
        }
        iVar53 = movmskps(iVar53,auVar170);
        if (iVar53 != 0) {
          fVar111 = (fVar254 - local_368._0_4_) * local_348 + local_368._0_4_;
          fVar141 = (fVar256 - local_368._4_4_) * fStack_344 + local_368._4_4_;
          fVar144 = (fVar268 - local_368._8_4_) * fStack_340 + local_368._8_4_;
          fVar149 = (fVar270 - local_368._12_4_) * fStack_33c + local_368._12_4_;
          fVar160 = local_320->depth_scale;
          auVar102._0_4_ = -(uint)(fVar160 * (fVar111 + fVar111) < local_358) & auVar170._0_4_;
          auVar102._4_4_ = -(uint)(fVar160 * (fVar141 + fVar141) < fStack_354) & auVar170._4_4_;
          auVar102._8_4_ = -(uint)(fVar160 * (fVar144 + fVar144) < fStack_350) & auVar170._8_4_;
          auVar102._12_4_ = -(uint)(fVar160 * (fVar149 + fVar149) < fStack_34c) & auVar170._12_4_;
          iVar53 = movmskps((int)local_320,auVar102);
          fVar160 = local_358;
          fVar111 = fStack_354;
          fVar141 = fStack_350;
          fVar144 = fStack_34c;
          fVar149 = local_348;
          fVar159 = fStack_344;
          fVar177 = fStack_340;
          fVar178 = fStack_33c;
          if (iVar53 != 0) {
            local_1e8 = local_1e8 + local_1e8 + -1.0;
            fStack_1e4 = fStack_1e4 + fStack_1e4 + -1.0;
            fStack_1e0 = fStack_1e0 + fStack_1e0 + -1.0;
            fStack_1dc = fStack_1dc + fStack_1dc + -1.0;
            local_168 = local_348;
            fStack_164 = fStack_344;
            fStack_160 = fStack_340;
            fStack_15c = fStack_33c;
            local_158 = local_1e8;
            fStack_154 = fStack_1e4;
            fStack_150 = fStack_1e0;
            fStack_14c = fStack_1dc;
            local_148 = local_358;
            fStack_144 = fStack_354;
            fStack_140 = fStack_350;
            fStack_13c = fStack_34c;
            local_138 = 0;
            local_134 = iVar20;
            local_128 = CONCAT44(fStack_2a4,local_2a8);
            uStack_120 = CONCAT44(fStack_29c,fStack_2a0);
            local_118 = CONCAT44(fStack_2b4,local_2b8);
            uStack_110 = CONCAT44(fStack_2ac,fStack_2b0);
            local_108 = CONCAT44(fStack_2c4,local_2c8);
            uStack_100 = CONCAT44(fStack_2bc,fStack_2c0);
            local_f8 = CONCAT44(fStack_294,local_298);
            uStack_f0 = CONCAT44(fStack_28c,fStack_290);
            local_e8 = auVar102;
            uVar67 = (ray->super_RayK<1>).mask;
            if ((pGVar21->mask & uVar67) != 0) {
              local_338 = auVar102;
              fVar110 = 1.0 / fVar110;
              local_d8[0] = fVar110 * (local_348 + 0.0);
              local_d8[1] = fVar110 * (fStack_344 + 1.0);
              local_d8[2] = fVar110 * (fStack_340 + 2.0);
              local_d8[3] = fVar110 * (fStack_33c + 3.0);
              local_c8 = CONCAT44(fStack_1e4,local_1e8);
              uStack_c0 = CONCAT44(fStack_1dc,fStack_1e0);
              local_b8[0] = local_358;
              local_b8[1] = fStack_354;
              local_b8[2] = fStack_350;
              local_b8[3] = fStack_34c;
              auVar128._0_4_ = auVar102._0_4_ & (uint)local_358;
              auVar128._4_4_ = auVar102._4_4_ & (uint)fStack_354;
              auVar128._8_4_ = auVar102._8_4_ & (uint)fStack_350;
              auVar128._12_4_ = auVar102._12_4_ & (uint)fStack_34c;
              auVar152._0_8_ = CONCAT44(~auVar102._4_4_,~auVar102._0_4_) & 0x7f8000007f800000;
              auVar152._8_4_ = ~auVar102._8_4_ & 0x7f800000;
              auVar152._12_4_ = ~auVar102._12_4_ & 0x7f800000;
              auVar152 = auVar152 | auVar128;
              auVar171._4_4_ = auVar152._0_4_;
              auVar171._0_4_ = auVar152._4_4_;
              auVar171._8_4_ = auVar152._12_4_;
              auVar171._12_4_ = auVar152._8_4_;
              auVar75 = minps(auVar171,auVar152);
              auVar129._0_8_ = auVar75._8_8_;
              auVar129._8_4_ = auVar75._0_4_;
              auVar129._12_4_ = auVar75._4_4_;
              auVar75 = minps(auVar129,auVar75);
              auVar130._0_8_ =
                   CONCAT44(-(uint)(auVar75._4_4_ == auVar152._4_4_) & auVar102._4_4_,
                            -(uint)(auVar75._0_4_ == auVar152._0_4_) & auVar102._0_4_);
              auVar130._8_4_ = -(uint)(auVar75._8_4_ == auVar152._8_4_) & auVar102._8_4_;
              auVar130._12_4_ = -(uint)(auVar75._12_4_ == auVar152._12_4_) & auVar102._12_4_;
              iVar53 = movmskps(uVar67,auVar130);
              if (iVar53 != 0) {
                auVar102._8_4_ = auVar130._8_4_;
                auVar102._0_8_ = auVar130._0_8_;
                auVar102._12_4_ = auVar130._12_4_;
              }
              uVar67 = movmskps(iVar53,auVar102);
              lVar65 = 0;
              if (uVar67 != 0) {
                for (; (uVar67 >> lVar65 & 1) == 0; lVar65 = lVar65 + 1) {
                }
              }
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar21->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar110 = local_d8[lVar65];
                fVar179 = *(float *)((long)&local_c8 + lVar65 * 4);
                fVar185 = 1.0 - fVar110;
                fVar187 = fVar110 * fVar185 + fVar110 * fVar185;
                fVar186 = fVar185 * fVar185 * -3.0;
                fVar210 = (fVar185 * fVar185 - fVar187) * 3.0;
                fVar185 = (fVar187 - fVar110 * fVar110) * 3.0;
                fVar187 = fVar110 * fVar110 * 3.0;
                (ray->super_RayK<1>).tfar = local_b8[lVar65];
                *(ulong *)&(ray->Ng).field_0 =
                     CONCAT44(fVar186 * fStack_2a4 +
                              fVar210 * fStack_2b4 + fVar185 * fStack_2c4 + fVar187 * fStack_294,
                              fVar186 * local_2a8 +
                              fVar210 * local_2b8 + fVar185 * local_2c8 + fVar187 * local_298);
                (ray->Ng).field_0.field_0.z =
                     fVar186 * fStack_2a0 +
                     fVar210 * fStack_2b0 + fVar185 * fStack_2c0 + fVar187 * fStack_290;
                ray->u = fVar110;
                ray->v = fVar179;
                ray->primID = (uint)local_3c0;
                ray->geomID = (uint)local_3e0;
                ray->instID[0] = context->user->instID[0];
                ray->instPrimID[0] = context->user->instPrimID[0];
                pRVar60 = (RTCIntersectArguments *)context;
              }
              else {
                _local_498 = ZEXT416((uint)(ray->super_RayK<1>).tfar);
LAB_00ae4ba0:
                local_23c = local_d8[lVar65];
                local_238 = *(undefined4 *)((long)&local_c8 + lVar65 * 4);
                (ray->super_RayK<1>).tfar = local_b8[lVar65];
                local_318.context = context->user;
                fVar110 = 1.0 - local_23c;
                fVar185 = local_23c * fVar110 + local_23c * fVar110;
                fVar179 = fVar110 * fVar110 * -3.0;
                fVar186 = (fVar110 * fVar110 - fVar185) * 3.0;
                fVar110 = (fVar185 - local_23c * local_23c) * 3.0;
                fVar185 = local_23c * local_23c * 3.0;
                local_248 = CONCAT44(fVar179 * fStack_2a4 +
                                     fVar186 * fStack_2b4 +
                                     fVar110 * fStack_2c4 + fVar185 * fStack_294,
                                     fVar179 * local_2a8 +
                                     fVar186 * local_2b8 + fVar110 * local_2c8 + fVar185 * local_298
                                    );
                local_240 = fVar179 * fStack_2a0 +
                            fVar186 * fStack_2b0 + fVar110 * fStack_2c0 + fVar185 * fStack_290;
                local_234 = (int)local_3c0;
                local_230 = (int)local_3e0;
                local_22c = (local_318.context)->instID[0];
                local_228 = (local_318.context)->instPrimID[0];
                local_47c._0_4_ = -NAN;
                local_318.valid = (int *)local_47c;
                pRVar60 = (RTCIntersectArguments *)pGVar21->userPtr;
                local_318.geometryUserPtr = pRVar60;
                local_318.ray = (RTCRayN *)ray;
                local_318.hit = (RTCHitN *)&local_248;
                local_318.N = 1;
                if ((pGVar21->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                   ((*pGVar21->intersectionFilterN)(&local_318), uVar61 = extraout_RDX_01,
                   fVar161 = local_458, fVar208 = fStack_454, fVar209 = fStack_450,
                   uVar54 = aStack_44c.field_0.x, fVar160 = local_358, fVar111 = fStack_354,
                   fVar141 = fStack_350, fVar144 = fStack_34c, fVar149 = local_348,
                   fVar159 = fStack_344, fVar177 = fStack_340, fVar178 = fStack_33c,
                   fVar73 = local_428, fVar214 = fStack_424, fVar215 = fStack_420,
                   fVar216 = fStack_41c, fVar109 = local_418, fVar222 = fStack_414,
                   fVar223 = fStack_410, fVar228 = fStack_40c,
                   (((RayK<1> *)local_318.valid)->org).field_0.m128[0] != 0.0)) {
                  pRVar60 = context->args;
                  if (((RTCIntersectArguments *)pRVar60->filter != (RTCIntersectArguments *)0x0) &&
                     (((((ulong)*(Scene **)&pRVar60->flags & 2) != 0 ||
                       (((pGVar21->field_8).field_0x2 & 0x40) != 0)) &&
                      ((*(code *)pRVar60->filter)(&local_318), uVar61 = extraout_RDX_02,
                      fVar161 = local_458, fVar208 = fStack_454, fVar209 = fStack_450,
                      uVar54 = aStack_44c.field_0.x, fVar160 = local_358, fVar111 = fStack_354,
                      fVar141 = fStack_350, fVar144 = fStack_34c, fVar149 = local_348,
                      fVar159 = fStack_344, fVar177 = fStack_340, fVar178 = fStack_33c,
                      fVar73 = local_428, fVar214 = fStack_424, fVar215 = fStack_420,
                      fVar216 = fStack_41c, fVar109 = local_418, fVar222 = fStack_414,
                      fVar223 = fStack_410, fVar228 = fStack_40c,
                      (((RayK<1> *)local_318.valid)->org).field_0.m128[0] == 0.0))))
                  goto LAB_00ae4e06;
                  (((Vec3f *)((long)local_318.ray + 0x30))->field_0).field_0.x =
                       *(float *)local_318.hit;
                  (((Vec3f *)((long)local_318.ray + 0x30))->field_0).field_0.y =
                       *(float *)(local_318.hit + 4);
                  (((Vec3f *)((long)local_318.ray + 0x30))->field_0).field_0.z =
                       *(float *)(local_318.hit + 8);
                  *(float *)((long)local_318.ray + 0x3c) = *(float *)(local_318.hit + 0xc);
                  *(float *)((long)local_318.ray + 0x40) = *(float *)(local_318.hit + 0x10);
                  *(float *)((long)local_318.ray + 0x44) = *(float *)(local_318.hit + 0x14);
                  *(float *)((long)local_318.ray + 0x48) = *(float *)(local_318.hit + 0x18);
                  uVar61 = (ulong)(uint)*(float *)(local_318.hit + 0x1c);
                  *(float *)((long)local_318.ray + 0x4c) = *(float *)(local_318.hit + 0x1c);
                  pRVar60 = (RTCIntersectArguments *)(ulong)(uint)*(float *)(local_318.hit + 0x20);
                  *(float *)((long)local_318.ray + 0x50) = *(float *)(local_318.hit + 0x20);
                  pRVar57 = (RayHit *)local_318.ray;
                }
                else {
LAB_00ae4e06:
                  (ray->super_RayK<1>).tfar = (float)local_498._0_4_;
                  pRVar57 = (RayHit *)local_318.valid;
                  fVar161 = local_458;
                  fVar208 = fStack_454;
                  fVar209 = fStack_450;
                  uVar54 = aStack_44c.field_0.x;
                  fVar160 = local_358;
                  fVar111 = fStack_354;
                  fVar141 = fStack_350;
                  fVar144 = fStack_34c;
                  fVar149 = local_348;
                  fVar159 = fStack_344;
                  fVar177 = fStack_340;
                  fVar178 = fStack_33c;
                  fVar73 = local_428;
                  fVar214 = fStack_424;
                  fVar215 = fStack_420;
                  fVar216 = fStack_41c;
                  fVar109 = local_418;
                  fVar222 = fStack_414;
                  fVar223 = fStack_410;
                  fVar228 = fStack_40c;
                }
                *(undefined4 *)(local_338 + lVar65 * 4) = 0;
                fVar110 = (ray->super_RayK<1>).tfar;
                local_498._0_4_ = (ray->super_RayK<1>).tfar;
                local_498._4_4_ = (ray->super_RayK<1>).mask;
                fStack_490 = (float)(ray->super_RayK<1>).id;
                fStack_48c = (float)(ray->super_RayK<1>).flags;
                auVar106._0_4_ = -(uint)(fVar160 <= fVar110) & local_338._0_4_;
                auVar106._4_4_ = -(uint)(fVar111 <= fVar110) & local_338._4_4_;
                auVar106._8_4_ = -(uint)(fVar141 <= fVar110) & local_338._8_4_;
                auVar106._12_4_ = -(uint)(fVar144 <= fVar110) & local_338._12_4_;
                local_338 = auVar106;
                iVar53 = movmskps((int)pRVar57,auVar106);
                if (iVar53 != 0) {
                  auVar138._0_4_ = auVar106._0_4_ & (uint)fVar160;
                  auVar138._4_4_ = auVar106._4_4_ & (uint)fVar111;
                  auVar138._8_4_ = auVar106._8_4_ & (uint)fVar141;
                  auVar138._12_4_ = auVar106._12_4_ & (uint)fVar144;
                  auVar158._0_8_ = CONCAT44(~auVar106._4_4_,~auVar106._0_4_) & 0x7f8000007f800000;
                  auVar158._8_4_ = ~auVar106._8_4_ & 0x7f800000;
                  auVar158._12_4_ = ~auVar106._12_4_ & 0x7f800000;
                  auVar158 = auVar158 | auVar138;
                  auVar176._4_4_ = auVar158._0_4_;
                  auVar176._0_4_ = auVar158._4_4_;
                  auVar176._8_4_ = auVar158._12_4_;
                  auVar176._12_4_ = auVar158._8_4_;
                  auVar75 = minps(auVar176,auVar158);
                  auVar139._0_8_ = auVar75._8_8_;
                  auVar139._8_4_ = auVar75._0_4_;
                  auVar139._12_4_ = auVar75._4_4_;
                  auVar75 = minps(auVar139,auVar75);
                  auVar140._0_8_ =
                       CONCAT44(-(uint)(auVar75._4_4_ == auVar158._4_4_) & auVar106._4_4_,
                                -(uint)(auVar75._0_4_ == auVar158._0_4_) & auVar106._0_4_);
                  auVar140._8_4_ = -(uint)(auVar75._8_4_ == auVar158._8_4_) & auVar106._8_4_;
                  auVar140._12_4_ = -(uint)(auVar75._12_4_ == auVar158._12_4_) & auVar106._12_4_;
                  iVar53 = movmskps(iVar53,auVar140);
                  if (iVar53 != 0) {
                    auVar106._8_4_ = auVar140._8_4_;
                    auVar106._0_8_ = auVar140._0_8_;
                    auVar106._12_4_ = auVar140._12_4_;
                  }
                  uVar55 = movmskps(iVar53,auVar106);
                  uVar58 = CONCAT44((int)((ulong)pRVar57 >> 0x20),uVar55);
                  lVar65 = 0;
                  if (uVar58 != 0) {
                    for (; (uVar58 >> lVar65 & 1) == 0; lVar65 = lVar65 + 1) {
                    }
                  }
                  goto LAB_00ae4ba0;
                }
              }
              iVar59 = (int)pRVar60;
            }
          }
          local_358 = fVar160;
          fStack_354 = fVar111;
          fStack_350 = fVar141;
          fStack_34c = fVar144;
          local_348 = fVar149;
          fStack_344 = fVar159;
          fStack_340 = fVar177;
          fStack_33c = fVar178;
          fVar210 = local_408;
        }
      }
      if (4 < iVar20) {
        local_418 = fVar109;
        fStack_414 = fVar222;
        fStack_410 = fVar223;
        fStack_40c = fVar228;
        local_68 = iVar20;
        iStack_64 = iVar20;
        iStack_60 = iVar20;
        iStack_5c = iVar20;
        local_208 = fStack_1fc;
        fStack_204 = fStack_1fc;
        fStack_200 = fStack_1fc;
        local_78 = 1.0 / (float)local_218._0_4_;
        fStack_74 = local_78;
        fStack_70 = local_78;
        fStack_6c = local_78;
        lVar65 = 4;
        fStack_404 = fVar210;
        local_408 = fVar210;
        fStack_400 = fVar210;
        fStack_3fc = fVar210;
        do {
          uVar68 = (uint)lVar65;
          bVar24 = (int)(uVar68 | 1) < iStack_64;
          bVar25 = (int)(uVar68 | 2) < iStack_60;
          uStack_470 = -(uint)bVar25;
          bVar26 = (int)(uVar68 | 3) < iStack_5c;
          aStack_46c.m128[0] = (float)-(uint)bVar26;
          fStack_474 = (float)-(uint)bVar24;
          local_47c._4_4_ = -(uint)((int)uVar68 < local_68);
          pRVar60 = (RTCIntersectArguments *)(bezier_basis0 + lVar23);
          pauVar7 = (undefined1 (*) [16])((long)&pRVar60->flags + lVar65 * 4);
          fVar160 = *(float *)*pauVar7;
          fVar109 = *(float *)(*pauVar7 + 4);
          fVar110 = *(float *)(*pauVar7 + 8);
          auVar31 = *(undefined1 (*) [12])*pauVar7;
          fVar111 = *(float *)(*pauVar7 + 0xc);
          pfVar1 = (float *)(lVar23 + 0x21aa768 + lVar65 * 4);
          local_378 = *pfVar1;
          fStack_374 = pfVar1[1];
          fStack_370 = pfVar1[2];
          fStack_36c = pfVar1[3];
          pfVar1 = (float *)(lVar23 + 0x21aabec + lVar65 * 4);
          local_388 = *pfVar1;
          fStack_384 = pfVar1[1];
          fStack_380 = pfVar1[2];
          fStack_37c = pfVar1[3];
          pfVar1 = (float *)(lVar23 + 0x21ab070 + lVar65 * 4);
          local_278 = *pfVar1;
          fStack_274 = pfVar1[1];
          fStack_270 = pfVar1[2];
          fStack_26c = pfVar1[3];
          local_1a8 = local_188 * fVar160 +
                      aStack_44c.field_0.y * local_378 +
                      local_3b8 * local_388 + local_438 * local_278;
          fStack_1a4 = fStack_184 * fVar109 +
                       aStack_44c.field_0.z * fStack_374 +
                       fStack_3b4 * fStack_384 + fStack_434 * fStack_274;
          fStack_1a0 = fStack_180 * fVar110 +
                       fStack_440 * fStack_370 +
                       fStack_3b0 * fStack_380 + (float)auStack_430[0] * fStack_270;
          fStack_19c = fStack_17c * fVar111 +
                       fStack_43c * fStack_36c +
                       fStack_3ac * fStack_37c + (float)auStack_42c[0] * fStack_26c;
          local_288 = local_198 * fVar160 +
                      aStack_46c.m128[1] * local_378 + fVar161 * local_388 + fVar73 * local_278;
          fStack_284 = fStack_194 * fVar109 +
                       aStack_46c.m128[2] * fStack_374 + fVar208 * fStack_384 + fVar214 * fStack_274
          ;
          fStack_280 = fStack_190 * fVar110 +
                       aStack_46c.m128[3] * fStack_370 + fVar209 * fStack_380 + fVar215 * fStack_270
          ;
          fStack_27c = fStack_18c * fVar111 +
                       fStack_45c * fStack_36c + (float)uVar54 * fStack_37c + fVar216 * fStack_26c;
          _local_1b8 = *pauVar7;
          local_3a8._0_4_ =
               local_a8 * fVar160 +
               local_98 * local_378 + local_88 * local_388 + local_58 * local_278;
          local_3a8._4_4_ =
               fStack_a4 * fVar109 +
               fStack_94 * fStack_374 + fStack_84 * fStack_384 + fStack_54 * fStack_274;
          fStack_3a0 = fStack_a0 * fVar110 +
                       fStack_90 * fStack_370 + fStack_80 * fStack_380 + fStack_50 * fStack_270;
          fStack_39c = fStack_9c * fVar111 +
                       fStack_8c * fStack_36c + fStack_7c * fStack_37c + fStack_4c * fStack_26c;
          puVar9 = bezier_basis1 + lVar23;
          uVar28 = *(undefined8 *)(puVar9 + lVar65 * 4);
          uVar29 = *(undefined8 *)((long)(puVar9 + lVar65 * 4) + 8);
          pfVar1 = (float *)(lVar23 + 0x21acb88 + lVar65 * 4);
          fVar160 = *pfVar1;
          fVar109 = pfVar1[1];
          fVar110 = pfVar1[2];
          fVar141 = pfVar1[3];
          pfVar1 = (float *)(lVar23 + 0x21ad00c + lVar65 * 4);
          fVar144 = *pfVar1;
          fVar149 = pfVar1[1];
          fVar159 = pfVar1[2];
          fVar177 = pfVar1[3];
          pauVar10 = (undefined1 (*) [12])(lVar23 + 0x21ad490 + lVar65 * 4);
          fVar178 = *(float *)*pauVar10;
          fVar179 = *(float *)(*pauVar10 + 4);
          fVar185 = *(float *)(*pauVar10 + 8);
          auVar32 = *pauVar10;
          fVar186 = *(float *)pauVar10[1];
          local_3d8._0_4_ = (float)uVar28;
          local_3d8._4_4_ = (float)((ulong)uVar28 >> 0x20);
          uStack_3d0._0_4_ = (float)uVar29;
          uStack_3d0._4_4_ = (float)((ulong)uVar29 >> 0x20);
          fVar210 = local_188 * (float)local_3d8 +
                    aStack_44c.field_0.y * fVar160 + local_3b8 * fVar144 + local_438 * fVar178;
          fVar222 = fStack_184 * local_3d8._4_4_ +
                    aStack_44c.field_0.z * fVar109 + fStack_3b4 * fVar149 + fStack_434 * fVar179;
          fVar223 = fStack_180 * (float)uStack_3d0 +
                    fStack_440 * fVar110 + fStack_3b0 * fVar159 + (float)auStack_430[0] * fVar185;
          fVar228 = fStack_17c * uStack_3d0._4_4_ +
                    fStack_43c * fVar141 + fStack_3ac * fVar177 + (float)auStack_42c[0] * fVar186;
          fVar234 = local_198 * (float)local_3d8 +
                    aStack_46c.m128[1] * fVar160 + fVar161 * fVar144 + fVar73 * fVar178;
          fVar274 = fStack_194 * local_3d8._4_4_ +
                    aStack_46c.m128[2] * fVar109 + fVar208 * fVar149 + fVar214 * fVar179;
          fVar224 = fStack_190 * (float)uStack_3d0 +
                    aStack_46c.m128[3] * fVar110 + fVar209 * fVar159 + fVar215 * fVar185;
          fVar226 = fStack_18c * uStack_3d0._4_4_ +
                    fStack_45c * fVar141 + (float)uVar54 * fVar177 + fVar216 * fVar186;
          auVar266._0_4_ =
               local_a8 * (float)local_3d8 +
               local_98 * fVar160 + local_88 * fVar144 + local_58 * fVar178;
          auVar266._4_4_ =
               fStack_a4 * local_3d8._4_4_ +
               fStack_94 * fVar109 + fStack_84 * fVar149 + fStack_54 * fVar179;
          auVar266._8_4_ =
               fStack_a0 * (float)uStack_3d0 +
               fStack_90 * fVar110 + fStack_80 * fVar159 + fStack_50 * fVar185;
          auVar266._12_4_ =
               fStack_9c * uStack_3d0._4_4_ +
               fStack_8c * fVar141 + fStack_7c * fVar177 + fStack_4c * fVar186;
          fVar214 = fVar210 - local_1a8;
          fVar215 = fVar222 - fStack_1a4;
          fVar216 = fVar223 - fStack_1a0;
          fVar233 = fVar228 - fStack_19c;
          fVar185 = fVar234 - local_288;
          fVar187 = fVar274 - fStack_284;
          fVar208 = fVar224 - fStack_280;
          fVar209 = fVar226 - fStack_27c;
          fVar73 = local_288 * fVar214 - local_1a8 * fVar185;
          fVar161 = fStack_284 * fVar215 - fStack_1a4 * fVar187;
          fVar178 = fStack_280 * fVar216 - fStack_1a0 * fVar208;
          fVar179 = fStack_27c * fVar233 - fStack_19c * fVar209;
          auVar75 = maxps(_local_3a8,auVar266);
          bVar52 = fVar73 * fVar73 <=
                   auVar75._0_4_ * auVar75._0_4_ * (fVar214 * fVar214 + fVar185 * fVar185) &&
                   (int)uVar68 < local_68;
          auVar290._0_4_ = -(uint)bVar52;
          bVar24 = fVar161 * fVar161 <=
                   auVar75._4_4_ * auVar75._4_4_ * (fVar215 * fVar215 + fVar187 * fVar187) && bVar24
          ;
          auVar290._4_4_ = -(uint)bVar24;
          bVar25 = fVar178 * fVar178 <=
                   auVar75._8_4_ * auVar75._8_4_ * (fVar216 * fVar216 + fVar208 * fVar208) && bVar25
          ;
          auVar290._8_4_ = -(uint)bVar25;
          bVar26 = fVar179 * fVar179 <=
                   auVar75._12_4_ * auVar75._12_4_ * (fVar233 * fVar233 + fVar209 * fVar209) &&
                   bVar26;
          auVar290._12_4_ = -(uint)bVar26;
          uVar67 = movmskps((int)uVar61,auVar290);
          uVar61 = (ulong)uVar67;
          fVar73 = local_398;
          fVar161 = fStack_394;
          fVar178 = fStack_390;
          fVar179 = fStack_38c;
          if (uVar67 != 0) {
            local_368 = auVar266;
            _local_1c8 = auVar290;
            local_218._4_4_ = fVar215;
            local_218._0_4_ = fVar214;
            fStack_210 = fVar216;
            fStack_20c = fVar233;
            local_1d8 = fVar185;
            fStack_1d4 = fVar187;
            fStack_1d0 = fVar208;
            fStack_1cc = fVar209;
            local_498._0_4_ = auVar32._0_4_;
            local_498._4_4_ = auVar32._4_4_;
            fStack_490 = auVar32._8_4_;
            fVar273 = (float)local_498._0_4_ * local_418 + fVar144 * local_268 + fVar160 * local_258
                      + (float)local_3d8 * (float)local_3f8._0_4_;
            fVar276 = (float)local_498._4_4_ * fStack_414 + fVar149 * fStack_264 +
                      fVar109 * fStack_254 + local_3d8._4_4_ * (float)local_3f8._4_4_;
            fVar283 = fStack_490 * fStack_410 + fVar159 * fStack_260 + fVar110 * fStack_250 +
                      (float)uStack_3d0 * fStack_3f0;
            fVar285 = fVar186 * fStack_40c + fVar177 * fStack_25c + fVar141 * fStack_24c +
                      uStack_3d0._4_4_ * fStack_3ec;
            local_1b8._0_4_ = auVar31._0_4_;
            local_1b8._4_4_ = auVar31._4_4_;
            fStack_1b0 = auVar31._8_4_;
            fVar296 = local_278 * local_418 + local_388 * local_268 + local_378 * local_258 +
                      (float)local_1b8._0_4_ * (float)local_3f8._0_4_;
            fVar112 = fStack_274 * fStack_414 + fStack_384 * fStack_264 + fStack_374 * fStack_254 +
                      (float)local_1b8._4_4_ * (float)local_3f8._4_4_;
            fVar113 = fStack_270 * fStack_410 + fStack_380 * fStack_260 + fStack_370 * fStack_250 +
                      fStack_1b0 * fStack_3f0;
            fVar142 = fStack_26c * fStack_40c + fStack_37c * fStack_25c + fStack_36c * fStack_24c +
                      fVar111 * fStack_3ec;
            pfVar1 = (float *)(lVar23 + 0x21ab4f4 + lVar65 * 4);
            fVar160 = *pfVar1;
            fVar73 = pfVar1[1];
            fVar109 = pfVar1[2];
            fVar110 = pfVar1[3];
            pfVar1 = (float *)(lVar23 + 0x21ab978 + lVar65 * 4);
            fVar111 = *pfVar1;
            fVar141 = pfVar1[1];
            fVar144 = pfVar1[2];
            fVar149 = pfVar1[3];
            pfVar1 = (float *)(lVar23 + 0x21abdfc + lVar65 * 4);
            fVar159 = *pfVar1;
            fVar161 = pfVar1[1];
            fVar177 = pfVar1[2];
            fVar178 = pfVar1[3];
            pfVar1 = (float *)(lVar23 + 0x21ac280 + lVar65 * 4);
            fVar179 = *pfVar1;
            fVar186 = pfVar1[1];
            fVar227 = pfVar1[2];
            fVar235 = pfVar1[3];
            fVar143 = local_188 * fVar160 +
                      aStack_44c.field_0.y * fVar111 + local_3b8 * fVar159 + local_438 * fVar179;
            fVar145 = fStack_184 * fVar73 +
                      aStack_44c.field_0.z * fVar141 + fStack_3b4 * fVar161 + fStack_434 * fVar186;
            fVar146 = fStack_180 * fVar109 +
                      fStack_440 * fVar144 + fStack_3b0 * fVar177 + (float)auStack_430[0] * fVar227;
            fVar147 = fStack_17c * fVar110 +
                      fStack_43c * fVar149 + fStack_3ac * fVar178 + (float)auStack_42c[0] * fVar235;
            fVar305 = local_198 * fVar160 +
                      aStack_46c.m128[1] * fVar111 + local_458 * fVar159 + local_428 * fVar179;
            fVar257 = fStack_194 * fVar73 +
                      aStack_46c.m128[2] * fVar141 + fStack_454 * fVar161 + fStack_424 * fVar186;
            fVar269 = fStack_190 * fVar109 +
                      aStack_46c.m128[3] * fVar144 + fStack_450 * fVar177 + fStack_420 * fVar227;
            fVar271 = fStack_18c * fVar110 +
                      fStack_45c * fVar149 + aStack_44c.field_0.x * fVar178 + fStack_41c * fVar235;
            pfVar1 = (float *)(lVar23 + 0x21ad914 + lVar65 * 4);
            fVar240 = *pfVar1;
            fVar241 = pfVar1[1];
            fVar242 = pfVar1[2];
            fVar250 = pfVar1[3];
            pfVar1 = (float *)(lVar23 + 0x21ae21c + lVar65 * 4);
            fVar252 = *pfVar1;
            fVar254 = pfVar1[1];
            fVar256 = pfVar1[2];
            fVar268 = pfVar1[3];
            pfVar1 = (float *)(lVar23 + 0x21ae6a0 + lVar65 * 4);
            fVar270 = *pfVar1;
            fVar272 = pfVar1[1];
            fVar275 = pfVar1[2];
            fVar282 = pfVar1[3];
            pfVar1 = (float *)(lVar23 + 0x21add98 + lVar65 * 4);
            fVar284 = *pfVar1;
            fVar286 = pfVar1[1];
            fVar299 = pfVar1[2];
            fVar302 = pfVar1[3];
            fVar148 = local_188 * fVar240 +
                      aStack_44c.field_0.y * fVar284 + local_3b8 * fVar252 + local_438 * fVar270;
            fVar243 = fStack_184 * fVar241 +
                      aStack_44c.field_0.z * fVar286 + fStack_3b4 * fVar254 + fStack_434 * fVar272;
            fVar251 = fStack_180 * fVar242 +
                      fStack_440 * fVar299 + fStack_3b0 * fVar256 + (float)auStack_430[0] * fVar275;
            fVar253 = fStack_17c * fVar250 +
                      fStack_43c * fVar302 + fStack_3ac * fVar268 + (float)auStack_42c[0] * fVar282;
            fVar287 = local_198 * fVar240 +
                      aStack_46c.m128[1] * fVar284 + local_458 * fVar252 + local_428 * fVar270;
            fVar297 = fStack_194 * fVar241 +
                      aStack_46c.m128[2] * fVar286 + fStack_454 * fVar254 + fStack_424 * fVar272;
            fVar300 = fStack_190 * fVar242 +
                      aStack_46c.m128[3] * fVar299 + fStack_450 * fVar256 + fStack_420 * fVar275;
            fVar303 = fStack_18c * fVar250 +
                      fStack_45c * fVar302 + aStack_44c.field_0.x * fVar268 + fStack_41c * fVar282;
            auVar267._0_8_ = CONCAT44(fVar145,fVar143) & 0x7fffffff7fffffff;
            auVar267._8_4_ = ABS(fVar146);
            auVar267._12_4_ = ABS(fVar147);
            auVar205._0_8_ = CONCAT44(fVar257,fVar305) & 0x7fffffff7fffffff;
            auVar205._8_4_ = ABS(fVar269);
            auVar205._12_4_ = ABS(fVar271);
            auVar75 = maxps(auVar267,auVar205);
            auVar280._0_8_ =
                 CONCAT44(fVar73 * (float)local_3f8._4_4_ +
                          fVar141 * fStack_254 + fVar161 * fStack_264 + fVar186 * fStack_414,
                          fVar160 * (float)local_3f8._0_4_ +
                          fVar111 * local_258 + fVar159 * local_268 + fVar179 * local_418) &
                 0x7fffffff7fffffff;
            auVar280._8_4_ =
                 ABS(fVar109 * fStack_3f0 +
                     fVar144 * fStack_250 + fVar177 * fStack_260 + fVar227 * fStack_410);
            auVar280._12_4_ =
                 ABS(fVar110 * fStack_3ec +
                     fVar149 * fStack_24c + fVar178 * fStack_25c + fVar235 * fStack_40c);
            auVar75 = maxps(auVar75,auVar280);
            uVar67 = -(uint)(local_408 <= auVar75._0_4_);
            uVar69 = -(uint)(fStack_404 <= auVar75._4_4_);
            uVar70 = -(uint)(fStack_400 <= auVar75._8_4_);
            uVar71 = -(uint)(fStack_3fc <= auVar75._12_4_);
            auVar206._0_4_ = ~uVar67 & (uint)fVar214;
            auVar206._4_4_ = ~uVar69 & (uint)fVar215;
            auVar206._8_4_ = ~uVar70 & (uint)fVar216;
            auVar206._12_4_ = ~uVar71 & (uint)fVar233;
            auVar249._0_4_ = (uint)fVar143 & uVar67;
            auVar249._4_4_ = (uint)fVar145 & uVar69;
            auVar249._8_4_ = (uint)fVar146 & uVar70;
            auVar249._12_4_ = (uint)fVar147 & uVar71;
            auVar249 = auVar249 | auVar206;
            fVar161 = (float)(~uVar67 & (uint)fVar185 | (uint)fVar305 & uVar67);
            fVar178 = (float)(~uVar69 & (uint)fVar187 | (uint)fVar257 & uVar69);
            fVar227 = (float)(~uVar70 & (uint)fVar208 | (uint)fVar269 & uVar70);
            fVar235 = (float)(~uVar71 & (uint)fVar209 | (uint)fVar271 & uVar71);
            auVar281._0_8_ = CONCAT44(fVar243,fVar148) & 0x7fffffff7fffffff;
            auVar281._8_4_ = ABS(fVar251);
            auVar281._12_4_ = ABS(fVar253);
            auVar153._0_8_ = CONCAT44(fVar297,fVar287) & 0x7fffffff7fffffff;
            auVar153._8_4_ = ABS(fVar300);
            auVar153._12_4_ = ABS(fVar303);
            auVar75 = maxps(auVar281,auVar153);
            auVar103._0_8_ =
                 CONCAT44(fVar241 * (float)local_3f8._4_4_ +
                          fVar286 * fStack_254 + fVar254 * fStack_264 + fVar272 * fStack_414,
                          fVar240 * (float)local_3f8._0_4_ +
                          fVar284 * local_258 + fVar252 * local_268 + fVar270 * local_418) &
                 0x7fffffff7fffffff;
            auVar103._8_4_ =
                 ABS(fVar242 * fStack_3f0 +
                     fVar299 * fStack_250 + fVar256 * fStack_260 + fVar275 * fStack_410);
            auVar103._12_4_ =
                 ABS(fVar250 * fStack_3ec +
                     fVar302 * fStack_24c + fVar268 * fStack_25c + fVar282 * fStack_40c);
            auVar75 = maxps(auVar75,auVar103);
            uVar67 = -(uint)(local_408 <= auVar75._0_4_);
            uVar69 = -(uint)(fStack_404 <= auVar75._4_4_);
            uVar70 = -(uint)(fStack_400 <= auVar75._8_4_);
            uVar71 = -(uint)(fStack_3fc <= auVar75._12_4_);
            fVar240 = (float)((uint)fVar148 & uVar67 | ~uVar67 & (uint)fVar214);
            fVar241 = (float)((uint)fVar243 & uVar69 | ~uVar69 & (uint)fVar215);
            fVar216 = (float)((uint)fVar251 & uVar70 | ~uVar70 & (uint)fVar216);
            fVar233 = (float)((uint)fVar253 & uVar71 | ~uVar71 & (uint)fVar233);
            fVar214 = (float)(~uVar67 & (uint)fVar185 | (uint)fVar287 & uVar67);
            fVar215 = (float)(~uVar69 & (uint)fVar187 | (uint)fVar297 & uVar69);
            fVar208 = (float)(~uVar70 & (uint)fVar208 | (uint)fVar300 & uVar70);
            fVar209 = (float)(~uVar71 & (uint)fVar209 | (uint)fVar303 & uVar71);
            fVar149 = auVar249._0_4_;
            fVar160 = auVar249._4_4_;
            fVar73 = auVar249._8_4_;
            fVar109 = auVar249._12_4_;
            auVar181._0_4_ = fVar161 * fVar161 + fVar149 * fVar149;
            auVar181._4_4_ = fVar178 * fVar178 + fVar160 * fVar160;
            auVar181._8_4_ = fVar227 * fVar227 + fVar73 * fVar73;
            auVar181._12_4_ = fVar235 * fVar235 + fVar109 * fVar109;
            auVar75 = rsqrtps(auVar206,auVar181);
            fVar110 = auVar75._0_4_;
            fVar111 = auVar75._4_4_;
            fVar141 = auVar75._8_4_;
            fVar144 = auVar75._12_4_;
            auVar207._0_4_ = fVar110 * fVar110 * auVar181._0_4_ * 0.5 * fVar110;
            auVar207._4_4_ = fVar111 * fVar111 * auVar181._4_4_ * 0.5 * fVar111;
            auVar207._8_4_ = fVar141 * fVar141 * auVar181._8_4_ * 0.5 * fVar141;
            auVar207._12_4_ = fVar144 * fVar144 * auVar181._12_4_ * 0.5 * fVar144;
            fVar179 = fVar110 * 1.5 - auVar207._0_4_;
            fVar185 = fVar111 * 1.5 - auVar207._4_4_;
            fVar186 = fVar141 * 1.5 - auVar207._8_4_;
            fVar187 = fVar144 * 1.5 - auVar207._12_4_;
            auVar182._0_4_ = fVar214 * fVar214 + fVar240 * fVar240;
            auVar182._4_4_ = fVar215 * fVar215 + fVar241 * fVar241;
            auVar182._8_4_ = fVar208 * fVar208 + fVar216 * fVar216;
            auVar182._12_4_ = fVar209 * fVar209 + fVar233 * fVar233;
            auVar75 = rsqrtps(auVar207,auVar182);
            fVar110 = auVar75._0_4_;
            fVar111 = auVar75._4_4_;
            fVar141 = auVar75._8_4_;
            fVar144 = auVar75._12_4_;
            fVar159 = fVar110 * 1.5 - fVar110 * fVar110 * auVar182._0_4_ * 0.5 * fVar110;
            fVar111 = fVar111 * 1.5 - fVar111 * fVar111 * auVar182._4_4_ * 0.5 * fVar111;
            fVar177 = fVar141 * 1.5 - fVar141 * fVar141 * auVar182._8_4_ * 0.5 * fVar141;
            fVar144 = fVar144 * 1.5 - fVar144 * fVar144 * auVar182._12_4_ * 0.5 * fVar144;
            fVar270 = fVar161 * fVar179 * (float)local_3a8._0_4_;
            fVar275 = fVar178 * fVar185 * (float)local_3a8._4_4_;
            fVar284 = fVar227 * fVar186 * fStack_3a0;
            fVar299 = fVar235 * fVar187 * fStack_39c;
            fVar141 = -fVar149 * fVar179 * (float)local_3a8._0_4_;
            fVar149 = -fVar160 * fVar185 * (float)local_3a8._4_4_;
            fVar161 = -fVar73 * fVar186 * fStack_3a0;
            fVar178 = -fVar109 * fVar187 * fStack_39c;
            fVar252 = fVar179 * 0.0 * (float)local_3a8._0_4_;
            fVar254 = fVar185 * 0.0 * (float)local_3a8._4_4_;
            fVar256 = fVar186 * 0.0 * fStack_3a0;
            fVar268 = fVar187 * 0.0 * fStack_39c;
            local_278 = fVar296 + fVar252;
            fStack_274 = fVar112 + fVar254;
            fStack_270 = fVar113 + fVar256;
            fStack_26c = fVar142 + fVar268;
            fVar305 = fVar214 * fVar159 * auVar266._0_4_;
            fVar257 = fVar215 * fVar111 * auVar266._4_4_;
            fVar269 = fVar208 * fVar177 * auVar266._8_4_;
            fVar271 = fVar209 * fVar144 * auVar266._12_4_;
            fVar208 = fVar210 + fVar305;
            fVar209 = fVar222 + fVar257;
            fVar214 = fVar223 + fVar269;
            fVar215 = fVar228 + fVar271;
            fVar179 = -fVar240 * fVar159 * auVar266._0_4_;
            fVar185 = -fVar241 * fVar111 * auVar266._4_4_;
            fVar186 = -fVar216 * fVar177 * auVar266._8_4_;
            fVar187 = -fVar233 * fVar144 * auVar266._12_4_;
            fVar160 = fVar234 + fVar179;
            fVar73 = fVar274 + fVar185;
            fVar109 = fVar224 + fVar186;
            fVar110 = fVar226 + fVar187;
            fVar240 = fVar159 * 0.0 * auVar266._0_4_;
            fVar241 = fVar111 * 0.0 * auVar266._4_4_;
            fVar242 = fVar177 * 0.0 * auVar266._8_4_;
            fVar250 = fVar144 * 0.0 * auVar266._12_4_;
            fVar111 = local_1a8 - fVar270;
            fVar144 = fStack_1a4 - fVar275;
            fVar159 = fStack_1a0 - fVar284;
            fVar177 = fStack_19c - fVar299;
            fVar272 = fVar273 + fVar240;
            fVar282 = fVar276 + fVar241;
            fVar286 = fVar283 + fVar242;
            fVar302 = fVar285 + fVar250;
            fVar216 = local_288 - fVar141;
            fVar233 = fStack_284 - fVar149;
            fVar227 = fStack_280 - fVar161;
            fVar235 = fStack_27c - fVar178;
            fVar296 = fVar296 - fVar252;
            fVar112 = fVar112 - fVar254;
            fVar113 = fVar113 - fVar256;
            fVar142 = fVar142 - fVar268;
            uVar67 = -(uint)(0.0 < (fVar216 * (fVar272 - fVar296) - fVar296 * (fVar160 - fVar216)) *
                                   0.0 + (fVar296 * (fVar208 - fVar111) -
                                         (fVar272 - fVar296) * fVar111) * 0.0 +
                                         ((fVar160 - fVar216) * fVar111 -
                                         (fVar208 - fVar111) * fVar216));
            uVar69 = -(uint)(0.0 < (fVar233 * (fVar282 - fVar112) - fVar112 * (fVar73 - fVar233)) *
                                   0.0 + (fVar112 * (fVar209 - fVar144) -
                                         (fVar282 - fVar112) * fVar144) * 0.0 +
                                         ((fVar73 - fVar233) * fVar144 -
                                         (fVar209 - fVar144) * fVar233));
            uVar70 = -(uint)(0.0 < (fVar227 * (fVar286 - fVar113) - fVar113 * (fVar109 - fVar227)) *
                                   0.0 + (fVar113 * (fVar214 - fVar159) -
                                         (fVar286 - fVar113) * fVar159) * 0.0 +
                                         ((fVar109 - fVar227) * fVar159 -
                                         (fVar214 - fVar159) * fVar227));
            uVar71 = -(uint)(0.0 < (fVar235 * (fVar302 - fVar142) - fVar142 * (fVar110 - fVar235)) *
                                   0.0 + (fVar142 * (fVar215 - fVar177) -
                                         (fVar302 - fVar142) * fVar177) * 0.0 +
                                         ((fVar110 - fVar235) * fVar177 -
                                         (fVar215 - fVar177) * fVar235));
            fVar270 = (float)((uint)(fVar210 - fVar305) & uVar67 |
                             ~uVar67 & (uint)(local_1a8 + fVar270));
            fVar275 = (float)((uint)(fVar222 - fVar257) & uVar69 |
                             ~uVar69 & (uint)(fStack_1a4 + fVar275));
            fVar284 = (float)((uint)(fVar223 - fVar269) & uVar70 |
                             ~uVar70 & (uint)(fStack_1a0 + fVar284));
            fVar299 = (float)((uint)(fVar228 - fVar271) & uVar71 |
                             ~uVar71 & (uint)(fStack_19c + fVar299));
            local_47c._4_4_ =
                 (uint)(fVar234 - fVar179) & uVar67 | ~uVar67 & (uint)(local_288 + fVar141);
            fStack_474 = (float)((uint)(fVar274 - fVar185) & uVar69 |
                                ~uVar69 & (uint)(fStack_284 + fVar149));
            uStack_470 = (uint)(fVar224 - fVar186) & uVar70 | ~uVar70 & (uint)(fStack_280 + fVar161)
            ;
            aStack_46c.m128[0] =
                 (float)((uint)(fVar226 - fVar187) & uVar71 | ~uVar71 & (uint)(fStack_27c + fVar178)
                        );
            fVar179 = (float)((uint)(fVar273 - fVar240) & uVar67 | ~uVar67 & (uint)local_278);
            fVar185 = (float)((uint)(fVar276 - fVar241) & uVar69 | ~uVar69 & (uint)fStack_274);
            fVar186 = (float)((uint)(fVar283 - fVar242) & uVar70 | ~uVar70 & (uint)fStack_270);
            fVar187 = (float)((uint)(fVar285 - fVar250) & uVar71 | ~uVar71 & (uint)fStack_26c);
            fVar141 = (float)((uint)fVar111 & uVar67 | ~uVar67 & (uint)fVar208);
            fVar149 = (float)((uint)fVar144 & uVar69 | ~uVar69 & (uint)fVar209);
            fVar161 = (float)((uint)fVar159 & uVar70 | ~uVar70 & (uint)fVar214);
            fVar178 = (float)((uint)fVar177 & uVar71 | ~uVar71 & (uint)fVar215);
            fVar210 = (float)((uint)fVar216 & uVar67 | ~uVar67 & (uint)fVar160);
            fVar222 = (float)((uint)fVar233 & uVar69 | ~uVar69 & (uint)fVar73);
            fVar223 = (float)((uint)fVar227 & uVar70 | ~uVar70 & (uint)fVar109);
            fVar228 = (float)((uint)fVar235 & uVar71 | ~uVar71 & (uint)fVar110);
            fVar234 = (float)((uint)fVar296 & uVar67 | ~uVar67 & (uint)fVar272);
            fVar274 = (float)((uint)fVar112 & uVar69 | ~uVar69 & (uint)fVar282);
            fVar224 = (float)((uint)fVar113 & uVar70 | ~uVar70 & (uint)fVar286);
            fVar226 = (float)((uint)fVar142 & uVar71 | ~uVar71 & (uint)fVar302);
            fVar208 = (float)((uint)fVar208 & uVar67 | ~uVar67 & (uint)fVar111) - fVar270;
            fVar209 = (float)((uint)fVar209 & uVar69 | ~uVar69 & (uint)fVar144) - fVar275;
            fVar214 = (float)((uint)fVar214 & uVar70 | ~uVar70 & (uint)fVar159) - fVar284;
            fVar215 = (float)((uint)fVar215 & uVar71 | ~uVar71 & (uint)fVar177) - fVar299;
            fVar216 = (float)((uint)fVar160 & uVar67 | ~uVar67 & (uint)fVar216) -
                      (float)local_47c._4_4_;
            fVar233 = (float)((uint)fVar73 & uVar69 | ~uVar69 & (uint)fVar233) - fStack_474;
            fVar227 = (float)((uint)fVar109 & uVar70 | ~uVar70 & (uint)fVar227) - (float)uStack_470;
            fVar235 = (float)((uint)fVar110 & uVar71 | ~uVar71 & (uint)fVar235) - aStack_46c.m128[0]
            ;
            fVar240 = (float)((uint)fVar272 & uVar67 | ~uVar67 & (uint)fVar296) - fVar179;
            fVar241 = (float)((uint)fVar282 & uVar69 | ~uVar69 & (uint)fVar112) - fVar185;
            fVar242 = (float)((uint)fVar286 & uVar70 | ~uVar70 & (uint)fVar113) - fVar186;
            fVar250 = (float)((uint)fVar302 & uVar71 | ~uVar71 & (uint)fVar142) - fVar187;
            fVar272 = fVar270 - fVar141;
            fVar282 = fVar275 - fVar149;
            fVar286 = fVar284 - fVar161;
            fVar302 = fVar299 - fVar178;
            fVar160 = (float)local_47c._4_4_ - fVar210;
            fVar73 = fStack_474 - fVar222;
            fVar109 = (float)uStack_470 - fVar223;
            fVar110 = aStack_46c.m128[0] - fVar228;
            local_3d8 = CONCAT44(fVar275,fVar270);
            uStack_3d0 = CONCAT44(fVar299,fVar284);
            fVar111 = fVar179 - fVar234;
            fVar144 = fVar185 - fVar274;
            fVar159 = fVar186 - fVar224;
            fVar177 = fVar187 - fVar226;
            fVar252 = ((float)local_47c._4_4_ * fVar240 - fVar179 * fVar216) * 0.0 +
                      (fVar179 * fVar208 - fVar270 * fVar240) * 0.0 +
                      (fVar270 * fVar216 - (float)local_47c._4_4_ * fVar208);
            fVar254 = (fStack_474 * fVar241 - fVar185 * fVar233) * 0.0 +
                      (fVar185 * fVar209 - fVar275 * fVar241) * 0.0 +
                      (fVar275 * fVar233 - fStack_474 * fVar209);
            auVar172._4_4_ = fVar254;
            auVar172._0_4_ = fVar252;
            fVar256 = ((float)uStack_470 * fVar242 - fVar186 * fVar227) * 0.0 +
                      (fVar186 * fVar214 - fVar284 * fVar242) * 0.0 +
                      (fVar284 * fVar227 - (float)uStack_470 * fVar214);
            fVar268 = (aStack_46c.m128[0] * fVar250 - fVar187 * fVar235) * 0.0 +
                      (fVar187 * fVar215 - fVar299 * fVar250) * 0.0 +
                      (fVar299 * fVar235 - aStack_46c.m128[0] * fVar215);
            auVar291._0_4_ =
                 (fVar210 * fVar111 - fVar234 * fVar160) * 0.0 +
                 (fVar234 * fVar272 - fVar141 * fVar111) * 0.0 +
                 (fVar141 * fVar160 - fVar210 * fVar272);
            auVar291._4_4_ =
                 (fVar222 * fVar144 - fVar274 * fVar73) * 0.0 +
                 (fVar274 * fVar282 - fVar149 * fVar144) * 0.0 +
                 (fVar149 * fVar73 - fVar222 * fVar282);
            auVar291._8_4_ =
                 (fVar223 * fVar159 - fVar224 * fVar109) * 0.0 +
                 (fVar224 * fVar286 - fVar161 * fVar159) * 0.0 +
                 (fVar161 * fVar109 - fVar223 * fVar286);
            auVar291._12_4_ =
                 (fVar228 * fVar177 - fVar226 * fVar110) * 0.0 +
                 (fVar226 * fVar302 - fVar178 * fVar177) * 0.0 +
                 (fVar178 * fVar110 - fVar228 * fVar302);
            auVar172._8_4_ = fVar256;
            auVar172._12_4_ = fVar268;
            auVar75 = maxps(auVar172,auVar291);
            bVar52 = auVar75._0_4_ <= 0.0 && bVar52;
            auVar173._0_4_ = -(uint)bVar52;
            bVar24 = auVar75._4_4_ <= 0.0 && bVar24;
            auVar173._4_4_ = -(uint)bVar24;
            bVar25 = auVar75._8_4_ <= 0.0 && bVar25;
            auVar173._8_4_ = -(uint)bVar25;
            bVar26 = auVar75._12_4_ <= 0.0 && bVar26;
            auVar173._12_4_ = -(uint)bVar26;
            iVar53 = movmskps((int)puVar9,auVar173);
            if (iVar53 == 0) {
LAB_00ae484f:
              auVar155._8_8_ = uStack_2d0;
              auVar155._0_8_ = local_2d8;
            }
            else {
              fVar141 = (ray->super_RayK<1>).tfar;
              fVar161 = fVar160 * fVar240 - fVar111 * fVar216;
              fVar178 = fVar73 * fVar241 - fVar144 * fVar233;
              fVar210 = fVar109 * fVar242 - fVar159 * fVar227;
              fVar222 = fVar110 * fVar250 - fVar177 * fVar235;
              fVar111 = fVar111 * fVar208 - fVar240 * fVar272;
              fVar144 = fVar144 * fVar209 - fVar241 * fVar282;
              fVar149 = fVar159 * fVar214 - fVar242 * fVar286;
              fVar159 = fVar177 * fVar215 - fVar250 * fVar302;
              fVar177 = fVar272 * fVar216 - fVar160 * fVar208;
              fVar208 = fVar282 * fVar233 - fVar73 * fVar209;
              fVar209 = fVar286 * fVar227 - fVar109 * fVar214;
              fVar214 = fVar302 * fVar235 - fVar110 * fVar215;
              auVar154._0_4_ = fVar111 * 0.0 + fVar177;
              auVar154._4_4_ = fVar144 * 0.0 + fVar208;
              auVar154._8_4_ = fVar149 * 0.0 + fVar209;
              auVar154._12_4_ = fVar159 * 0.0 + fVar214;
              auVar213._0_4_ = fVar161 * 0.0 + auVar154._0_4_;
              auVar213._4_4_ = fVar178 * 0.0 + auVar154._4_4_;
              auVar213._8_4_ = fVar210 * 0.0 + auVar154._8_4_;
              auVar213._12_4_ = fVar222 * 0.0 + auVar154._12_4_;
              auVar75 = rcpps(auVar154,auVar213);
              fVar160 = auVar75._0_4_;
              fVar73 = auVar75._4_4_;
              fVar109 = auVar75._8_4_;
              fVar110 = auVar75._12_4_;
              fVar160 = (1.0 - auVar213._0_4_ * fVar160) * fVar160 + fVar160;
              fVar73 = (1.0 - auVar213._4_4_ * fVar73) * fVar73 + fVar73;
              fVar109 = (1.0 - auVar213._8_4_ * fVar109) * fVar109 + fVar109;
              fVar110 = (1.0 - auVar213._12_4_ * fVar110) * fVar110 + fVar110;
              fVar111 = (fVar179 * fVar177 + (float)local_47c._4_4_ * fVar111 + fVar270 * fVar161) *
                        fVar160;
              fVar144 = (fVar185 * fVar208 + fStack_474 * fVar144 + fVar275 * fVar178) * fVar73;
              fVar149 = (fVar186 * fVar209 + (float)uStack_470 * fVar149 + fVar284 * fVar210) *
                        fVar109;
              fVar159 = (fVar187 * fVar214 + aStack_46c.m128[0] * fVar159 + fVar299 * fVar222) *
                        fVar110;
              bVar52 = (local_208 <= fVar111 && fVar111 <= fVar141) && bVar52;
              auVar183._0_4_ = -(uint)bVar52;
              bVar24 = (fStack_204 <= fVar144 && fVar144 <= fVar141) && bVar24;
              auVar183._4_4_ = -(uint)bVar24;
              bVar25 = (fStack_200 <= fVar149 && fVar149 <= fVar141) && bVar25;
              auVar183._8_4_ = -(uint)bVar25;
              bVar26 = (fStack_1fc <= fVar159 && fVar159 <= fVar141) && bVar26;
              auVar183._12_4_ = -(uint)bVar26;
              iVar53 = movmskps(iVar53,auVar183);
              if (iVar53 == 0) goto LAB_00ae484f;
              auVar184._0_8_ =
                   CONCAT44(-(uint)(auVar213._4_4_ != 0.0 && bVar24),
                            -(uint)(auVar213._0_4_ != 0.0 && bVar52));
              auVar184._8_4_ = -(uint)(auVar213._8_4_ != 0.0 && bVar25);
              auVar184._12_4_ = -(uint)(auVar213._12_4_ != 0.0 && bVar26);
              iVar53 = movmskps(iVar53,auVar184);
              auVar155._8_8_ = uStack_2d0;
              auVar155._0_8_ = local_2d8;
              if (iVar53 != 0) {
                fVar252 = fVar252 * fVar160;
                fVar254 = fVar254 * fVar73;
                fVar256 = fVar256 * fVar109;
                fVar268 = fVar268 * fVar110;
                local_2e8 = (float)((uint)(1.0 - fVar252) & uVar67 | ~uVar67 & (uint)fVar252);
                fStack_2e4 = (float)((uint)(1.0 - fVar254) & uVar69 | ~uVar69 & (uint)fVar254);
                fStack_2e0 = (float)((uint)(1.0 - fVar256) & uVar70 | ~uVar70 & (uint)fVar256);
                fStack_2dc = (float)((uint)(1.0 - fVar268) & uVar71 | ~uVar71 & (uint)fVar268);
                local_1f8 = (float)(~uVar67 & (uint)(auVar291._0_4_ * fVar160) |
                                   (uint)(1.0 - auVar291._0_4_ * fVar160) & uVar67);
                fStack_1f4 = (float)(~uVar69 & (uint)(auVar291._4_4_ * fVar73) |
                                    (uint)(1.0 - auVar291._4_4_ * fVar73) & uVar69);
                fStack_1f0 = (float)(~uVar70 & (uint)(auVar291._8_4_ * fVar109) |
                                    (uint)(1.0 - auVar291._8_4_ * fVar109) & uVar70);
                fStack_1ec = (float)(~uVar71 & (uint)(auVar291._12_4_ * fVar110) |
                                    (uint)(1.0 - auVar291._12_4_ * fVar110) & uVar71);
                auVar155._8_4_ = auVar184._8_4_;
                auVar155._0_8_ = auVar184._0_8_;
                auVar155._12_4_ = auVar184._12_4_;
                local_398 = fVar111;
                fStack_394 = fVar144;
                fStack_390 = fVar149;
                fStack_38c = fVar159;
              }
            }
            iVar53 = movmskps(iVar53,auVar155);
            fVar73 = local_398;
            fVar161 = fStack_394;
            fVar178 = fStack_390;
            fVar179 = fStack_38c;
            uVar28 = local_3d8;
            uVar29 = uStack_3d0;
            if (iVar53 != 0) {
              fVar109 = (auVar266._0_4_ - (float)local_3a8._0_4_) * local_2e8 +
                        (float)local_3a8._0_4_;
              fVar110 = (auVar266._4_4_ - (float)local_3a8._4_4_) * fStack_2e4 +
                        (float)local_3a8._4_4_;
              fVar111 = (auVar266._8_4_ - fStack_3a0) * fStack_2e0 + fStack_3a0;
              fVar141 = (auVar266._12_4_ - fStack_39c) * fStack_2dc + fStack_39c;
              fVar160 = local_320->depth_scale;
              auVar104._0_4_ = -(uint)(fVar160 * (fVar109 + fVar109) < local_398) & auVar155._0_4_;
              auVar104._4_4_ = -(uint)(fVar160 * (fVar110 + fVar110) < fStack_394) & auVar155._4_4_;
              auVar104._8_4_ = -(uint)(fVar160 * (fVar111 + fVar111) < fStack_390) & auVar155._8_4_;
              auVar104._12_4_ =
                   -(uint)(fVar160 * (fVar141 + fVar141) < fStack_38c) & auVar155._12_4_;
              iVar53 = movmskps((int)local_320,auVar104);
              if (iVar53 != 0) {
                local_1f8 = local_1f8 + local_1f8 + -1.0;
                fStack_1f4 = fStack_1f4 + fStack_1f4 + -1.0;
                fStack_1f0 = fStack_1f0 + fStack_1f0 + -1.0;
                fStack_1ec = fStack_1ec + fStack_1ec + -1.0;
                local_168 = local_2e8;
                fStack_164 = fStack_2e4;
                fStack_160 = fStack_2e0;
                fStack_15c = fStack_2dc;
                local_158 = local_1f8;
                fStack_154 = fStack_1f4;
                fStack_150 = fStack_1f0;
                fStack_14c = fStack_1ec;
                local_148 = local_398;
                fStack_144 = fStack_394;
                fStack_140 = fStack_390;
                fStack_13c = fStack_38c;
                local_138 = uVar68;
                local_134 = iVar20;
                local_128 = CONCAT44(fStack_2a4,local_2a8);
                uStack_120 = CONCAT44(fStack_29c,fStack_2a0);
                local_118 = CONCAT44(fStack_2b4,local_2b8);
                uStack_110 = CONCAT44(fStack_2ac,fStack_2b0);
                local_108 = CONCAT44(fStack_2c4,local_2c8);
                uStack_100 = CONCAT44(fStack_2bc,fStack_2c0);
                local_f8 = CONCAT44(fStack_294,local_298);
                uStack_f0 = CONCAT44(fStack_28c,fStack_290);
                local_e8 = auVar104;
                uVar62 = (context->scene->geometries).items[(long)local_3e0].ptr;
                uVar67 = (ray->super_RayK<1>).mask;
                pRVar60 = local_3e0;
                if ((((Geometry *)uVar62)->mask & uVar67) != 0) {
                  local_338 = auVar104;
                  fVar160 = (float)(int)uVar68;
                  local_d8[0] = (fVar160 + local_2e8 + 0.0) * local_78;
                  local_d8[1] = (fVar160 + fStack_2e4 + 1.0) * fStack_74;
                  local_d8[2] = (fVar160 + fStack_2e0 + 2.0) * fStack_70;
                  local_d8[3] = (fVar160 + fStack_2dc + 3.0) * fStack_6c;
                  local_c8 = CONCAT44(fStack_1f4,local_1f8);
                  uStack_c0 = CONCAT44(fStack_1ec,fStack_1f0);
                  local_b8[0] = local_398;
                  local_b8[1] = fStack_394;
                  local_b8[2] = fStack_390;
                  local_b8[3] = fStack_38c;
                  auVar132._0_4_ = auVar104._0_4_ & (uint)local_398;
                  auVar132._4_4_ = auVar104._4_4_ & (uint)fStack_394;
                  auVar132._8_4_ = auVar104._8_4_ & (uint)fStack_390;
                  auVar132._12_4_ = auVar104._12_4_ & (uint)fStack_38c;
                  auVar156._0_8_ = CONCAT44(~auVar104._4_4_,~auVar104._0_4_) & 0x7f8000007f800000;
                  auVar156._8_4_ = ~auVar104._8_4_ & 0x7f800000;
                  auVar156._12_4_ = ~auVar104._12_4_ & 0x7f800000;
                  auVar156 = auVar156 | auVar132;
                  auVar174._4_4_ = auVar156._0_4_;
                  auVar174._0_4_ = auVar156._4_4_;
                  auVar174._8_4_ = auVar156._12_4_;
                  auVar174._12_4_ = auVar156._8_4_;
                  auVar75 = minps(auVar174,auVar156);
                  auVar133._0_8_ = auVar75._8_8_;
                  auVar133._8_4_ = auVar75._0_4_;
                  auVar133._12_4_ = auVar75._4_4_;
                  auVar75 = minps(auVar133,auVar75);
                  auVar134._0_8_ =
                       CONCAT44(-(uint)(auVar75._4_4_ == auVar156._4_4_) & auVar104._4_4_,
                                -(uint)(auVar75._0_4_ == auVar156._0_4_) & auVar104._0_4_);
                  auVar134._8_4_ = -(uint)(auVar75._8_4_ == auVar156._8_4_) & auVar104._8_4_;
                  auVar134._12_4_ = -(uint)(auVar75._12_4_ == auVar156._12_4_) & auVar104._12_4_;
                  iVar53 = movmskps(uVar67,auVar134);
                  if (iVar53 != 0) {
                    auVar104._8_4_ = auVar134._8_4_;
                    auVar104._0_8_ = auVar134._0_8_;
                    auVar104._12_4_ = auVar134._12_4_;
                  }
                  uVar67 = movmskps(iVar53,auVar104);
                  lVar64 = 0;
                  if (uVar67 != 0) {
                    for (; (uVar67 >> lVar64 & 1) == 0; lVar64 = lVar64 + 1) {
                    }
                  }
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (((Geometry *)uVar62)->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar160 = local_d8[lVar64];
                    fVar109 = *(float *)((long)&local_c8 + lVar64 * 4);
                    fVar110 = 1.0 - fVar160;
                    fVar141 = fVar160 * fVar110 + fVar160 * fVar110;
                    fVar111 = fVar110 * fVar110 * -3.0;
                    fVar144 = (fVar110 * fVar110 - fVar141) * 3.0;
                    fVar110 = (fVar141 - fVar160 * fVar160) * 3.0;
                    fVar141 = fVar160 * fVar160 * 3.0;
                    (ray->super_RayK<1>).tfar = local_b8[lVar64];
                    *(ulong *)&(ray->Ng).field_0 =
                         CONCAT44(fVar111 * fStack_2a4 +
                                  fVar144 * fStack_2b4 + fVar110 * fStack_2c4 + fVar141 * fStack_294
                                  ,fVar111 * local_2a8 +
                                   fVar144 * local_2b8 + fVar110 * local_2c8 + fVar141 * local_298);
                    (ray->Ng).field_0.field_0.z =
                         fVar111 * fStack_2a0 +
                         fVar144 * fStack_2b0 + fVar110 * fStack_2c0 + fVar141 * fStack_290;
                    ray->u = fVar160;
                    ray->v = fVar109;
                    ray->primID = (uint)local_3c0;
                    ray->geomID = (uint)local_3e0;
                    ray->instID[0] = context->user->instID[0];
                    ray->instPrimID[0] = context->user->instPrimID[0];
                    pRVar60 = (RTCIntersectArguments *)context;
                  }
                  else {
                    _local_498 = ZEXT416((uint)(ray->super_RayK<1>).tfar);
                    stack0xfffffffffffffb88 = uVar62;
LAB_00ae48ac:
                    local_23c = local_d8[lVar64];
                    local_238 = *(undefined4 *)((long)&local_c8 + lVar64 * 4);
                    (ray->super_RayK<1>).tfar = local_b8[lVar64];
                    local_318.context = context->user;
                    fVar160 = 1.0 - local_23c;
                    fVar110 = local_23c * fVar160 + local_23c * fVar160;
                    fVar109 = fVar160 * fVar160 * -3.0;
                    fVar111 = (fVar160 * fVar160 - fVar110) * 3.0;
                    fVar160 = (fVar110 - local_23c * local_23c) * 3.0;
                    fVar110 = local_23c * local_23c * 3.0;
                    local_248 = CONCAT44(fVar109 * fStack_2a4 +
                                         fVar111 * fStack_2b4 +
                                         fVar160 * fStack_2c4 + fVar110 * fStack_294,
                                         fVar109 * local_2a8 +
                                         fVar111 * local_2b8 +
                                         fVar160 * local_2c8 + fVar110 * local_298);
                    local_240 = fVar109 * fStack_2a0 +
                                fVar111 * fStack_2b0 + fVar160 * fStack_2c0 + fVar110 * fStack_290;
                    local_234 = (int)local_3c0;
                    local_230 = (int)local_3e0;
                    local_22c = (local_318.context)->instID[0];
                    local_228 = (local_318.context)->instPrimID[0];
                    local_47c._0_4_ = -NAN;
                    local_318.valid = (int *)local_47c;
                    pRVar60 = (RTCIntersectArguments *)((Geometry *)uVar62)->userPtr;
                    local_318.geometryUserPtr = pRVar60;
                    local_318.ray = (RTCRayN *)ray;
                    local_318.hit = (RTCHitN *)&local_248;
                    local_318.N = 1;
                    if ((((Geometry *)uVar62)->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                       ((*((Geometry *)uVar62)->intersectionFilterN)(&local_318),
                       uVar61 = extraout_RDX, uVar62 = stack0xfffffffffffffb88, fVar73 = local_398,
                       fVar161 = fStack_394, fVar178 = fStack_390, fVar179 = fStack_38c,
                       (((RayK<1> *)local_318.valid)->org).field_0.m128[0] != 0.0)) {
                      pRVar60 = context->args;
                      if (((RTCIntersectArguments *)pRVar60->filter != (RTCIntersectArguments *)0x0)
                         && (((((ulong)*(Scene **)&pRVar60->flags & 2) != 0 ||
                              (((((Geometry *)uVar62)->field_8).field_0x2 & 0x40) != 0)) &&
                             ((*(code *)pRVar60->filter)(&local_318), uVar61 = extraout_RDX_00,
                             uVar62 = stack0xfffffffffffffb88, fVar73 = local_398,
                             fVar161 = fStack_394, fVar178 = fStack_390, fVar179 = fStack_38c,
                             (((RayK<1> *)local_318.valid)->org).field_0.m128[0] == 0.0))))
                      goto LAB_00ae4acd;
                      (((Vec3f *)((long)local_318.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_318.hit;
                      (((Vec3f *)((long)local_318.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_318.hit + 4);
                      (((Vec3f *)((long)local_318.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_318.hit + 8);
                      *(float *)((long)local_318.ray + 0x3c) = *(float *)(local_318.hit + 0xc);
                      *(float *)((long)local_318.ray + 0x40) = *(float *)(local_318.hit + 0x10);
                      *(float *)((long)local_318.ray + 0x44) = *(float *)(local_318.hit + 0x14);
                      *(float *)((long)local_318.ray + 0x48) = *(float *)(local_318.hit + 0x18);
                      uVar61 = (ulong)(uint)*(float *)(local_318.hit + 0x1c);
                      *(float *)((long)local_318.ray + 0x4c) = *(float *)(local_318.hit + 0x1c);
                      pRVar60 = (RTCIntersectArguments *)
                                (ulong)(uint)*(float *)(local_318.hit + 0x20);
                      *(float *)((long)local_318.ray + 0x50) = *(float *)(local_318.hit + 0x20);
                      pRVar57 = (RayHit *)local_318.ray;
                    }
                    else {
LAB_00ae4acd:
                      (ray->super_RayK<1>).tfar = (float)local_498._0_4_;
                      pRVar57 = (RayHit *)local_318.valid;
                      uVar62 = stack0xfffffffffffffb88;
                      fVar73 = local_398;
                      fVar161 = fStack_394;
                      fVar178 = fStack_390;
                      fVar179 = fStack_38c;
                    }
                    *(undefined4 *)(local_338 + lVar64 * 4) = 0;
                    fVar160 = (ray->super_RayK<1>).tfar;
                    local_498._0_4_ = (ray->super_RayK<1>).tfar;
                    local_498._4_4_ = (ray->super_RayK<1>).mask;
                    fStack_490 = (float)(ray->super_RayK<1>).id;
                    fStack_48c = (float)(ray->super_RayK<1>).flags;
                    auVar105._0_4_ = -(uint)(fVar73 <= fVar160) & local_338._0_4_;
                    auVar105._4_4_ = -(uint)(fVar161 <= fVar160) & local_338._4_4_;
                    auVar105._8_4_ = -(uint)(fVar178 <= fVar160) & local_338._8_4_;
                    auVar105._12_4_ = -(uint)(fVar179 <= fVar160) & local_338._12_4_;
                    local_338 = auVar105;
                    iVar53 = movmskps((int)pRVar57,auVar105);
                    uVar28 = local_3d8;
                    uVar29 = uStack_3d0;
                    if (iVar53 != 0) {
                      auVar135._0_4_ = auVar105._0_4_ & (uint)fVar73;
                      auVar135._4_4_ = auVar105._4_4_ & (uint)fVar161;
                      auVar135._8_4_ = auVar105._8_4_ & (uint)fVar178;
                      auVar135._12_4_ = auVar105._12_4_ & (uint)fVar179;
                      auVar157._0_8_ =
                           CONCAT44(~auVar105._4_4_,~auVar105._0_4_) & 0x7f8000007f800000;
                      auVar157._8_4_ = ~auVar105._8_4_ & 0x7f800000;
                      auVar157._12_4_ = ~auVar105._12_4_ & 0x7f800000;
                      auVar157 = auVar157 | auVar135;
                      auVar175._4_4_ = auVar157._0_4_;
                      auVar175._0_4_ = auVar157._4_4_;
                      auVar175._8_4_ = auVar157._12_4_;
                      auVar175._12_4_ = auVar157._8_4_;
                      auVar75 = minps(auVar175,auVar157);
                      auVar136._0_8_ = auVar75._8_8_;
                      auVar136._8_4_ = auVar75._0_4_;
                      auVar136._12_4_ = auVar75._4_4_;
                      auVar75 = minps(auVar136,auVar75);
                      auVar137._0_8_ =
                           CONCAT44(-(uint)(auVar75._4_4_ == auVar157._4_4_) & auVar105._4_4_,
                                    -(uint)(auVar75._0_4_ == auVar157._0_4_) & auVar105._0_4_);
                      auVar137._8_4_ = -(uint)(auVar75._8_4_ == auVar157._8_4_) & auVar105._8_4_;
                      auVar137._12_4_ = -(uint)(auVar75._12_4_ == auVar157._12_4_) & auVar105._12_4_
                      ;
                      iVar53 = movmskps(iVar53,auVar137);
                      if (iVar53 != 0) {
                        auVar105._8_4_ = auVar137._8_4_;
                        auVar105._0_8_ = auVar137._0_8_;
                        auVar105._12_4_ = auVar137._12_4_;
                      }
                      uVar54 = movmskps(iVar53,auVar105);
                      uVar58 = CONCAT44((int)((ulong)pRVar57 >> 0x20),uVar54);
                      lVar64 = 0;
                      if (uVar58 != 0) {
                        for (; (uVar58 >> lVar64 & 1) == 0; lVar64 = lVar64 + 1) {
                        }
                      }
                      goto LAB_00ae48ac;
                    }
                  }
                }
              }
            }
          }
          uStack_3d0 = uVar29;
          local_3d8 = uVar28;
          iVar59 = (int)pRVar60;
          local_398 = fVar73;
          fStack_394 = fVar161;
          fStack_390 = fVar178;
          fStack_38c = fVar179;
          lVar65 = lVar65 + 4;
          fVar161 = local_458;
          fVar208 = fStack_454;
          fVar209 = fStack_450;
          uVar54 = aStack_44c.field_0.x;
          fVar73 = local_428;
          fVar214 = fStack_424;
          fVar215 = fStack_420;
          fVar216 = fStack_41c;
        } while ((int)lVar65 < iVar20);
      }
      fVar160 = (ray->super_RayK<1>).tfar;
      auVar131._4_4_ = -(uint)(fStack_44 <= fVar160);
      auVar131._0_4_ = -(uint)(local_48 <= fVar160);
      auVar131._8_4_ = -(uint)(fStack_40 <= fVar160);
      auVar131._12_4_ = -(uint)(fStack_3c <= fVar160);
      uVar67 = movmskps(iVar59,auVar131);
      uVar66 = uVar66 & uVar66 + 0xf & uVar67;
    } while (uVar66 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }